

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  unsigned_short *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  _func_int *p_Var6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  float afVar134 [16];
  float afVar135 [16];
  float afVar136 [16];
  float afVar137 [16];
  float afVar138 [16];
  float afVar139 [16];
  int iVar140;
  uint uVar141;
  long lVar142;
  uint _elempack;
  int iVar143;
  ulong uVar144;
  long lVar145;
  undefined1 (*pauVar146) [32];
  long lVar147;
  ulong uVar148;
  long lVar149;
  long lVar150;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  long lVar151;
  undefined1 (*pauVar152) [16];
  long lVar153;
  undefined1 (*pauVar154) [16];
  long lVar155;
  undefined1 (*pauVar156) [16];
  long lVar157;
  undefined1 (*pauVar158) [16];
  undefined1 (*pauVar159) [32];
  long lVar160;
  int iVar161;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar162 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  float fVar217;
  float fVar218;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar219 [16];
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar224 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  v4sf one;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  __m128 pos;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar332 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar333 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar334 [64];
  undefined1 (*local_378) [32];
  int *piStack_370;
  size_t local_368;
  int local_360;
  Allocator *local_358;
  int local_350;
  int local_34c;
  undefined8 local_348;
  int local_340;
  size_t local_338;
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [16];
  ulong local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  undefined1 local_1e8 [16];
  float local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [32];
  ulong local_1a0;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  
  auVar163 = in_ZMM30._0_16_;
  local_350 = bottom_blob->dims;
  if (local_350 == 2) {
    iVar140 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
    local_34c = bottom_blob->w;
    if (bottom_blob->w == iVar140) {
      local_34c = iVar140;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                     (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                    bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
        innerproduct_gemm_fp16s_sse
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var6),
                   *(int *)(&this->field_0xe0 + (long)p_Var6),
                   (Mat *)(&this->field_0xe8 + (long)p_Var6),opt);
        return 0;
      }
    }
  }
  else {
    local_34c = bottom_blob->w;
  }
  piVar7 = bottom_blob->refcount;
  local_378 = (undefined1 (*) [32])bottom_blob->data;
  piStack_370 = bottom_blob->refcount;
  local_368 = bottom_blob->elemsize;
  local_360 = bottom_blob->elempack;
  local_358 = bottom_blob->allocator;
  local_348._0_4_ = bottom_blob->h;
  local_348._4_4_ = bottom_blob->d;
  local_340 = bottom_blob->c;
  local_338 = bottom_blob->cstep;
  iVar140 = local_350;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    iVar140 = bottom_blob->dims;
  }
  if (iVar140 != 1) {
    opt_flatten._16_48_ = SUB6448(*opt,0x10);
    opt_flatten._0_8_ = SUB648(*opt,0);
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_378);
  }
  uVar141 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  if (opt->use_packing_layout == true) {
    if ((uVar141 & 0xf) == 0) {
      _elempack = 0x10;
    }
    else if ((uVar141 & 7) == 0) {
      _elempack = 8;
    }
    else {
      _elempack = (uint)((uVar141 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  Mat::create(top_blob,(int)uVar141 / (int)_elempack,
              (ulong)_elempack * (local_368 / (ulong)(long)local_360),_elempack,opt->blob_allocator)
  ;
  afVar139 = _ps512_cephes_log_q2;
  afVar138 = _ps512_cephes_log_q1;
  afVar137 = _ps512_cephes_log_p8;
  afVar136 = _ps512_cephes_log_p7;
  afVar135 = _ps512_cephes_exp_p5;
  afVar134 = _ps512_cephes_exp_p4;
  afVar133 = _ps512_cephes_exp_p3;
  afVar132 = _ps512_cephes_exp_p2;
  afVar131 = _ps512_cephes_exp_p1;
  afVar130 = _ps512_cephes_exp_p0;
  afVar129 = _ps512_cephes_LOG2EF;
  afVar128 = _ps512_exp_lo;
  afVar127 = _ps512_exp_hi;
  afVar126 = _ps512_1;
  iVar140 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (_elempack == 0x10) {
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      uVar2 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
      iVar140 = local_360 * local_34c;
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      auVar301 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar326 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar301);
      auVar306 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar301);
      auVar311 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar316 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar301);
      uVar148 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar148 = 0;
      }
      auVar321 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar163 = vxorps_avx512vl(auVar163,auVar163);
      auVar334 = ZEXT1664(auVar163);
      auVar331 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (uVar144 = 0; uVar144 != uVar148; uVar144 = uVar144 + 1) {
        auVar163 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar333 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar332 = ZEXT1664(auVar163);
        if (lVar8 != 0) {
          auVar332 = *(undefined1 (*) [64])(lVar8 + uVar144 * 0x40);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar145 = (long)(this->weight_data_tm).w;
        pauVar159 = (undefined1 (*) [32])(uVar144 * lVar145 * sVar10 + (long)pvVar9);
        lVar150 = 0;
        lVar151 = 0;
        iVar143 = 0;
        auVar163 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar163);
        pauVar146 = local_378;
        for (; iVar143 + 7 < iVar140; iVar143 = iVar143 + 8) {
          auVar210 = vcvtph2ps_avx512f(*pauVar159);
          uVar3 = *(undefined4 *)*pauVar146;
          auVar211._4_4_ = uVar3;
          auVar211._0_4_ = uVar3;
          auVar211._8_4_ = uVar3;
          auVar211._12_4_ = uVar3;
          auVar211._16_4_ = uVar3;
          auVar211._20_4_ = uVar3;
          auVar211._24_4_ = uVar3;
          auVar211._28_4_ = uVar3;
          auVar211._32_4_ = uVar3;
          auVar211._36_4_ = uVar3;
          auVar211._40_4_ = uVar3;
          auVar211._44_4_ = uVar3;
          auVar211._48_4_ = uVar3;
          auVar211._52_4_ = uVar3;
          auVar211._56_4_ = uVar3;
          auVar211._60_4_ = uVar3;
          auVar332 = vfmadd231ps_avx512f(auVar332,auVar210,auVar211);
          auVar211 = vcvtph2ps_avx512f(pauVar159[1]);
          uVar3 = *(undefined4 *)(*pauVar146 + 4);
          auVar210._4_4_ = uVar3;
          auVar210._0_4_ = uVar3;
          auVar210._8_4_ = uVar3;
          auVar210._12_4_ = uVar3;
          auVar210._16_4_ = uVar3;
          auVar210._20_4_ = uVar3;
          auVar210._24_4_ = uVar3;
          auVar210._28_4_ = uVar3;
          auVar210._32_4_ = uVar3;
          auVar210._36_4_ = uVar3;
          auVar210._40_4_ = uVar3;
          auVar210._44_4_ = uVar3;
          auVar210._48_4_ = uVar3;
          auVar210._52_4_ = uVar3;
          auVar210._56_4_ = uVar3;
          auVar210._60_4_ = uVar3;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar211,auVar210);
          auVar211 = vcvtph2ps_avx512f(pauVar159[2]);
          uVar3 = *(undefined4 *)(*pauVar146 + 8);
          auVar213._4_4_ = uVar3;
          auVar213._0_4_ = uVar3;
          auVar213._8_4_ = uVar3;
          auVar213._12_4_ = uVar3;
          auVar213._16_4_ = uVar3;
          auVar213._20_4_ = uVar3;
          auVar213._24_4_ = uVar3;
          auVar213._28_4_ = uVar3;
          auVar213._32_4_ = uVar3;
          auVar213._36_4_ = uVar3;
          auVar213._40_4_ = uVar3;
          auVar213._44_4_ = uVar3;
          auVar213._48_4_ = uVar3;
          auVar213._52_4_ = uVar3;
          auVar213._56_4_ = uVar3;
          auVar213._60_4_ = uVar3;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar211,auVar213);
          auVar211 = vcvtph2ps_avx512f(pauVar159[3]);
          uVar3 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar111._4_4_ = uVar3;
          auVar111._0_4_ = uVar3;
          auVar111._8_4_ = uVar3;
          auVar111._12_4_ = uVar3;
          auVar111._16_4_ = uVar3;
          auVar111._20_4_ = uVar3;
          auVar111._24_4_ = uVar3;
          auVar111._28_4_ = uVar3;
          auVar111._32_4_ = uVar3;
          auVar111._36_4_ = uVar3;
          auVar111._40_4_ = uVar3;
          auVar111._44_4_ = uVar3;
          auVar111._48_4_ = uVar3;
          auVar111._52_4_ = uVar3;
          auVar111._56_4_ = uVar3;
          auVar111._60_4_ = uVar3;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar211,auVar111);
          auVar211 = vcvtph2ps_avx512f(pauVar159[4]);
          uVar3 = *(undefined4 *)(*pauVar146 + 0x10);
          auVar112._4_4_ = uVar3;
          auVar112._0_4_ = uVar3;
          auVar112._8_4_ = uVar3;
          auVar112._12_4_ = uVar3;
          auVar112._16_4_ = uVar3;
          auVar112._20_4_ = uVar3;
          auVar112._24_4_ = uVar3;
          auVar112._28_4_ = uVar3;
          auVar112._32_4_ = uVar3;
          auVar112._36_4_ = uVar3;
          auVar112._40_4_ = uVar3;
          auVar112._44_4_ = uVar3;
          auVar112._48_4_ = uVar3;
          auVar112._52_4_ = uVar3;
          auVar112._56_4_ = uVar3;
          auVar112._60_4_ = uVar3;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar211,auVar112);
          auVar211 = vcvtph2ps_avx512f(pauVar159[5]);
          uVar3 = *(undefined4 *)(*pauVar146 + 0x14);
          auVar113._4_4_ = uVar3;
          auVar113._0_4_ = uVar3;
          auVar113._8_4_ = uVar3;
          auVar113._12_4_ = uVar3;
          auVar113._16_4_ = uVar3;
          auVar113._20_4_ = uVar3;
          auVar113._24_4_ = uVar3;
          auVar113._28_4_ = uVar3;
          auVar113._32_4_ = uVar3;
          auVar113._36_4_ = uVar3;
          auVar113._40_4_ = uVar3;
          auVar113._44_4_ = uVar3;
          auVar113._48_4_ = uVar3;
          auVar113._52_4_ = uVar3;
          auVar113._56_4_ = uVar3;
          auVar113._60_4_ = uVar3;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar211,auVar113);
          auVar211 = vcvtph2ps_avx512f(pauVar159[6]);
          uVar3 = *(undefined4 *)(*pauVar146 + 0x18);
          auVar114._4_4_ = uVar3;
          auVar114._0_4_ = uVar3;
          auVar114._8_4_ = uVar3;
          auVar114._12_4_ = uVar3;
          auVar114._16_4_ = uVar3;
          auVar114._20_4_ = uVar3;
          auVar114._24_4_ = uVar3;
          auVar114._28_4_ = uVar3;
          auVar114._32_4_ = uVar3;
          auVar114._36_4_ = uVar3;
          auVar114._40_4_ = uVar3;
          auVar114._44_4_ = uVar3;
          auVar114._48_4_ = uVar3;
          auVar114._52_4_ = uVar3;
          auVar114._56_4_ = uVar3;
          auVar114._60_4_ = uVar3;
          in_ZMM18 = vfmadd231ps_avx512f(in_ZMM18,auVar211,auVar114);
          auVar211 = vcvtph2ps_avx512f(pauVar159[7]);
          uVar3 = *(undefined4 *)(*pauVar146 + 0x1c);
          auVar115._4_4_ = uVar3;
          auVar115._0_4_ = uVar3;
          auVar115._8_4_ = uVar3;
          auVar115._12_4_ = uVar3;
          auVar115._16_4_ = uVar3;
          auVar115._20_4_ = uVar3;
          auVar115._24_4_ = uVar3;
          auVar115._28_4_ = uVar3;
          auVar115._32_4_ = uVar3;
          auVar115._36_4_ = uVar3;
          auVar115._40_4_ = uVar3;
          auVar115._44_4_ = uVar3;
          auVar115._48_4_ = uVar3;
          auVar115._52_4_ = uVar3;
          auVar115._56_4_ = uVar3;
          auVar115._60_4_ = uVar3;
          auVar333 = vfmadd231ps_avx512f(auVar333,auVar211,auVar115);
          pauVar146 = pauVar146 + 1;
          pauVar159 = pauVar159 + 8;
          lVar151 = lVar151 + 0x20;
          lVar150 = lVar150 + 8;
        }
        lVar145 = sVar10 * uVar144 * lVar145;
        for (; iVar143 + 3 < iVar140; iVar143 = iVar143 + 4) {
          auVar211 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pvVar9 + lVar151 * 8 + lVar145))
          ;
          uVar3 = *(undefined4 *)(*local_378 + lVar151);
          auVar116._4_4_ = uVar3;
          auVar116._0_4_ = uVar3;
          auVar116._8_4_ = uVar3;
          auVar116._12_4_ = uVar3;
          auVar116._16_4_ = uVar3;
          auVar116._20_4_ = uVar3;
          auVar116._24_4_ = uVar3;
          auVar116._28_4_ = uVar3;
          auVar116._32_4_ = uVar3;
          auVar116._36_4_ = uVar3;
          auVar116._40_4_ = uVar3;
          auVar116._44_4_ = uVar3;
          auVar116._48_4_ = uVar3;
          auVar116._52_4_ = uVar3;
          auVar116._56_4_ = uVar3;
          auVar116._60_4_ = uVar3;
          auVar332 = vfmadd231ps_avx512f(auVar332,auVar211,auVar116);
          auVar211 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar151 * 8 + lVar145 + 0x20));
          uVar3 = *(undefined4 *)(*local_378 + lVar151 + 4);
          auVar117._4_4_ = uVar3;
          auVar117._0_4_ = uVar3;
          auVar117._8_4_ = uVar3;
          auVar117._12_4_ = uVar3;
          auVar117._16_4_ = uVar3;
          auVar117._20_4_ = uVar3;
          auVar117._24_4_ = uVar3;
          auVar117._28_4_ = uVar3;
          auVar117._32_4_ = uVar3;
          auVar117._36_4_ = uVar3;
          auVar117._40_4_ = uVar3;
          auVar117._44_4_ = uVar3;
          auVar117._48_4_ = uVar3;
          auVar117._52_4_ = uVar3;
          auVar117._56_4_ = uVar3;
          auVar117._60_4_ = uVar3;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar211,auVar117);
          auVar211 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar151 * 8 + lVar145 + 0x40));
          uVar3 = *(undefined4 *)(*local_378 + lVar151 + 8);
          auVar118._4_4_ = uVar3;
          auVar118._0_4_ = uVar3;
          auVar118._8_4_ = uVar3;
          auVar118._12_4_ = uVar3;
          auVar118._16_4_ = uVar3;
          auVar118._20_4_ = uVar3;
          auVar118._24_4_ = uVar3;
          auVar118._28_4_ = uVar3;
          auVar118._32_4_ = uVar3;
          auVar118._36_4_ = uVar3;
          auVar118._40_4_ = uVar3;
          auVar118._44_4_ = uVar3;
          auVar118._48_4_ = uVar3;
          auVar118._52_4_ = uVar3;
          auVar118._56_4_ = uVar3;
          auVar118._60_4_ = uVar3;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar211,auVar118);
          auVar211 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar151 * 8 + lVar145 + 0x60));
          uVar3 = *(undefined4 *)(*local_378 + lVar151 + 0xc);
          auVar119._4_4_ = uVar3;
          auVar119._0_4_ = uVar3;
          auVar119._8_4_ = uVar3;
          auVar119._12_4_ = uVar3;
          auVar119._16_4_ = uVar3;
          auVar119._20_4_ = uVar3;
          auVar119._24_4_ = uVar3;
          auVar119._28_4_ = uVar3;
          auVar119._32_4_ = uVar3;
          auVar119._36_4_ = uVar3;
          auVar119._40_4_ = uVar3;
          auVar119._44_4_ = uVar3;
          auVar119._48_4_ = uVar3;
          auVar119._52_4_ = uVar3;
          auVar119._56_4_ = uVar3;
          auVar119._60_4_ = uVar3;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar211,auVar119);
          pauVar159 = pauVar159 + 4;
          lVar151 = lVar151 + 0x10;
          lVar150 = lVar150 + 4;
        }
        for (; (int)lVar150 < iVar140; lVar150 = lVar150 + 1) {
          auVar186 = vlddqu_avx(*pauVar159);
          auVar211 = vcvtph2ps_avx512f(auVar186);
          uVar3 = *(undefined4 *)(*local_378 + lVar150 * 4);
          auVar120._4_4_ = uVar3;
          auVar120._0_4_ = uVar3;
          auVar120._8_4_ = uVar3;
          auVar120._12_4_ = uVar3;
          auVar120._16_4_ = uVar3;
          auVar120._20_4_ = uVar3;
          auVar120._24_4_ = uVar3;
          auVar120._28_4_ = uVar3;
          auVar120._32_4_ = uVar3;
          auVar120._36_4_ = uVar3;
          auVar120._40_4_ = uVar3;
          auVar120._44_4_ = uVar3;
          auVar120._48_4_ = uVar3;
          auVar120._52_4_ = uVar3;
          auVar120._56_4_ = uVar3;
          auVar120._60_4_ = uVar3;
          auVar332 = vfmadd231ps_avx512f(auVar332,auVar211,auVar120);
          pauVar159 = pauVar159 + 1;
        }
        auVar333 = vaddps_avx512f(in_ZMM18,auVar333);
        auVar211 = vaddps_avx512f(in_ZMM19,in_ZMM21);
        auVar333 = vaddps_avx512f(auVar333,auVar211);
        auVar211 = vaddps_avx512f(in_ZMM20,in_ZMM22);
        in_ZMM17 = vaddps_avx512f(auVar211,in_ZMM23);
        auVar333 = vaddps_avx512f(auVar333,in_ZMM17);
        auVar332 = vaddps_avx512f(auVar333,auVar332);
        in_ZMM16 = auVar332;
        switch(uVar2) {
        case 1:
          in_ZMM16 = vmaxps_avx512f(auVar332,auVar334);
          break;
        case 2:
          uVar13 = vcmpps_avx512f(auVar332,auVar334,1);
          uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar122._4_4_ = uVar3;
          auVar122._0_4_ = uVar3;
          auVar122._8_4_ = uVar3;
          auVar122._12_4_ = uVar3;
          auVar122._16_4_ = uVar3;
          auVar122._20_4_ = uVar3;
          auVar122._24_4_ = uVar3;
          auVar122._28_4_ = uVar3;
          auVar122._32_4_ = uVar3;
          auVar122._36_4_ = uVar3;
          auVar122._40_4_ = uVar3;
          auVar122._44_4_ = uVar3;
          auVar122._48_4_ = uVar3;
          auVar122._52_4_ = uVar3;
          auVar122._56_4_ = uVar3;
          auVar122._60_4_ = uVar3;
          auVar333 = vmulps_avx512f(auVar332,auVar122);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM16._0_4_ = (uint)bVar11 * auVar333._0_4_ | (uint)!bVar11 * auVar332._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM16._4_4_ = (uint)bVar11 * auVar333._4_4_ | (uint)!bVar11 * auVar332._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM16._8_4_ = (uint)bVar11 * auVar333._8_4_ | (uint)!bVar11 * auVar332._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM16._12_4_ = (uint)bVar11 * auVar333._12_4_ | (uint)!bVar11 * auVar332._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM16._16_4_ = (uint)bVar11 * auVar333._16_4_ | (uint)!bVar11 * auVar332._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM16._20_4_ = (uint)bVar11 * auVar333._20_4_ | (uint)!bVar11 * auVar332._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM16._24_4_ = (uint)bVar11 * auVar333._24_4_ | (uint)!bVar11 * auVar332._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM16._28_4_ = (uint)bVar11 * auVar333._28_4_ | (uint)!bVar11 * auVar332._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM16._32_4_ = (uint)bVar11 * auVar333._32_4_ | (uint)!bVar11 * auVar332._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM16._36_4_ = (uint)bVar11 * auVar333._36_4_ | (uint)!bVar11 * auVar332._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM16._40_4_ = (uint)bVar11 * auVar333._40_4_ | (uint)!bVar11 * auVar332._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM16._44_4_ = (uint)bVar11 * auVar333._44_4_ | (uint)!bVar11 * auVar332._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM16._48_4_ = (uint)bVar11 * auVar333._48_4_ | (uint)!bVar11 * auVar332._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM16._52_4_ = (uint)bVar11 * auVar333._52_4_ | (uint)!bVar11 * auVar332._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM16._56_4_ = (uint)bVar11 * auVar333._56_4_ | (uint)!bVar11 * auVar332._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM16._60_4_ = (uint)bVar11 * auVar333._60_4_ | (uint)!bVar11 * auVar332._60_4_;
          break;
        case 3:
          uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar121._4_4_ = uVar3;
          auVar121._0_4_ = uVar3;
          auVar121._8_4_ = uVar3;
          auVar121._12_4_ = uVar3;
          auVar121._16_4_ = uVar3;
          auVar121._20_4_ = uVar3;
          auVar121._24_4_ = uVar3;
          auVar121._28_4_ = uVar3;
          auVar121._32_4_ = uVar3;
          auVar121._36_4_ = uVar3;
          auVar121._40_4_ = uVar3;
          auVar121._44_4_ = uVar3;
          auVar121._48_4_ = uVar3;
          auVar121._52_4_ = uVar3;
          auVar121._56_4_ = uVar3;
          auVar121._60_4_ = uVar3;
          auVar333 = vmaxps_avx512f(auVar332,auVar121);
          uVar3 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar332._4_4_ = uVar3;
          auVar332._0_4_ = uVar3;
          auVar332._8_4_ = uVar3;
          auVar332._12_4_ = uVar3;
          auVar332._16_4_ = uVar3;
          auVar332._20_4_ = uVar3;
          auVar332._24_4_ = uVar3;
          auVar332._28_4_ = uVar3;
          auVar332._32_4_ = uVar3;
          auVar332._36_4_ = uVar3;
          auVar332._40_4_ = uVar3;
          auVar332._44_4_ = uVar3;
          auVar332._48_4_ = uVar3;
          auVar332._52_4_ = uVar3;
          auVar332._56_4_ = uVar3;
          auVar332._60_4_ = uVar3;
          in_ZMM16 = vminps_avx512f(auVar333,auVar332);
          break;
        case 4:
          auVar332 = vxorps_avx512dq(auVar332,auVar301);
          auVar332 = vminps_avx512f(auVar332,(undefined1  [64])afVar127);
          auVar332 = vmaxps_avx512f(auVar332,(undefined1  [64])afVar128);
          auVar333 = vfmadd213ps_avx512f((undefined1  [64])afVar129,auVar332,
                                         (undefined1  [64])afVar135);
          auVar211 = vrndscaleps_avx512f(auVar333,1);
          uVar13 = vcmpps_avx512f(auVar333,auVar211,1);
          auVar333 = vsubps_avx512f(auVar211,(undefined1  [64])afVar126);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM17._0_4_ = (uint)bVar11 * auVar333._0_4_ | (uint)!bVar11 * auVar211._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM17._4_4_ = (uint)bVar11 * auVar333._4_4_ | (uint)!bVar11 * auVar211._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM17._8_4_ = (uint)bVar11 * auVar333._8_4_ | (uint)!bVar11 * auVar211._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM17._12_4_ = (uint)bVar11 * auVar333._12_4_ | (uint)!bVar11 * auVar211._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM17._16_4_ = (uint)bVar11 * auVar333._16_4_ | (uint)!bVar11 * auVar211._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM17._20_4_ = (uint)bVar11 * auVar333._20_4_ | (uint)!bVar11 * auVar211._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM17._24_4_ = (uint)bVar11 * auVar333._24_4_ | (uint)!bVar11 * auVar211._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM17._28_4_ = (uint)bVar11 * auVar333._28_4_ | (uint)!bVar11 * auVar211._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM17._32_4_ = (uint)bVar11 * auVar333._32_4_ | (uint)!bVar11 * auVar211._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM17._36_4_ = (uint)bVar11 * auVar333._36_4_ | (uint)!bVar11 * auVar211._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM17._40_4_ = (uint)bVar11 * auVar333._40_4_ | (uint)!bVar11 * auVar211._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM17._44_4_ = (uint)bVar11 * auVar333._44_4_ | (uint)!bVar11 * auVar211._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM17._48_4_ = (uint)bVar11 * auVar333._48_4_ | (uint)!bVar11 * auVar211._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM17._52_4_ = (uint)bVar11 * auVar333._52_4_ | (uint)!bVar11 * auVar211._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM17._56_4_ = (uint)bVar11 * auVar333._56_4_ | (uint)!bVar11 * auVar211._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM17._60_4_ = (uint)bVar11 * auVar333._60_4_ | (uint)!bVar11 * auVar211._60_4_;
          auVar332 = vfmadd231ps_avx512f(auVar332,in_ZMM17,auVar326);
          auVar332 = vfmadd231ps_avx512f(auVar332,in_ZMM17,auVar306);
          auVar333 = vmulps_avx512f(auVar332,auVar332);
          auVar211 = vfmadd213ps_avx512f(auVar332,(undefined1  [64])afVar130,
                                         (undefined1  [64])afVar131);
          auVar211 = vfmadd213ps_avx512f(auVar211,auVar332,(undefined1  [64])afVar132);
          auVar211 = vfmadd213ps_avx512f(auVar211,auVar332,(undefined1  [64])afVar133);
          auVar211 = vfmadd213ps_avx512f(auVar211,auVar332,(undefined1  [64])afVar134);
          auVar211 = vfmadd213ps_avx512f(auVar211,auVar332,(undefined1  [64])afVar135);
          in_ZMM18 = vfmadd213ps_avx512f(auVar211,auVar333,auVar332);
          auVar332 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar126);
          auVar333 = vcvttps2dq_avx512f(in_ZMM17);
          auVar333 = vpaddd_avx512f(auVar333,auVar311);
          auVar333 = vpslld_avx512f(auVar333,0x17);
          auVar332 = vfmadd213ps_avx512f(auVar333,auVar332,auVar321);
          auVar333 = vrcp14ps_avx512f(auVar332);
          auVar332 = vfmsub213ps_avx512f(auVar332,auVar333,auVar321);
          in_ZMM16 = vfnmadd132ps_avx512vl(auVar332,auVar333,auVar333);
          break;
        case 5:
          auVar333 = vminps_avx512f(auVar332,(undefined1  [64])afVar127);
          auVar333 = vmaxps_avx512f(auVar333,(undefined1  [64])afVar128);
          auVar211 = vfmadd213ps_avx512f((undefined1  [64])afVar129,auVar333,
                                         (undefined1  [64])afVar135);
          auVar210 = vrndscaleps_avx512f(auVar211,1);
          uVar13 = vcmpps_avx512f(auVar211,auVar210,1);
          auVar211 = vsubps_avx512f(auVar210,(undefined1  [64])afVar126);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar212._0_4_ = (uint)bVar11 * auVar211._0_4_ | (uint)!bVar11 * auVar210._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar212._4_4_ = (uint)bVar11 * auVar211._4_4_ | (uint)!bVar11 * auVar210._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar212._8_4_ = (uint)bVar11 * auVar211._8_4_ | (uint)!bVar11 * auVar210._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar212._12_4_ = (uint)bVar11 * auVar211._12_4_ | (uint)!bVar11 * auVar210._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar212._16_4_ = (uint)bVar11 * auVar211._16_4_ | (uint)!bVar11 * auVar210._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar212._20_4_ = (uint)bVar11 * auVar211._20_4_ | (uint)!bVar11 * auVar210._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar212._24_4_ = (uint)bVar11 * auVar211._24_4_ | (uint)!bVar11 * auVar210._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar212._28_4_ = (uint)bVar11 * auVar211._28_4_ | (uint)!bVar11 * auVar210._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          auVar212._32_4_ = (uint)bVar11 * auVar211._32_4_ | (uint)!bVar11 * auVar210._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar212._36_4_ = (uint)bVar11 * auVar211._36_4_ | (uint)!bVar11 * auVar210._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar212._40_4_ = (uint)bVar11 * auVar211._40_4_ | (uint)!bVar11 * auVar210._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar212._44_4_ = (uint)bVar11 * auVar211._44_4_ | (uint)!bVar11 * auVar210._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar212._48_4_ = (uint)bVar11 * auVar211._48_4_ | (uint)!bVar11 * auVar210._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar212._52_4_ = (uint)bVar11 * auVar211._52_4_ | (uint)!bVar11 * auVar210._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar212._56_4_ = (uint)bVar11 * auVar211._56_4_ | (uint)!bVar11 * auVar210._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar212._60_4_ = (uint)bVar11 * auVar211._60_4_ | (uint)!bVar11 * auVar210._60_4_;
          auVar333 = vfmadd231ps_avx512f(auVar333,auVar212,auVar326);
          auVar333 = vfmadd231ps_avx512f(auVar333,auVar212,auVar306);
          auVar211 = vmulps_avx512f(auVar333,auVar333);
          auVar210 = vfmadd213ps_avx512f(auVar333,(undefined1  [64])afVar130,
                                         (undefined1  [64])afVar131);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar132);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar133);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar134);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar135);
          auVar333 = vfmadd213ps_avx512f(auVar210,auVar211,auVar333);
          auVar333 = vaddps_avx512f(auVar333,(undefined1  [64])afVar126);
          auVar211 = vcvttps2dq_avx512f(auVar212);
          auVar211 = vpaddd_avx512f(auVar211,auVar311);
          auVar211 = vpslld_avx512f(auVar211,0x17);
          auVar333 = vfmadd213ps_avx512f(auVar211,auVar333,auVar321);
          auVar211 = vmaxps_avx512f(auVar333,(undefined1  [64])_ps512_min_norm_pos);
          auVar210 = vpsrld_avx512f(auVar211,0x17);
          auVar211 = vpternlogd_avx512f(auVar211,(undefined1  [64])afVar135,
                                        (undefined1  [64])_ps512_inv_mant_mask,0xec);
          uVar13 = vcmpps_avx512f(auVar211,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar213 = vsubps_avx512f(auVar211,(undefined1  [64])afVar126);
          auVar211 = vaddps_avx512f(auVar213,auVar211);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar214._0_4_ = (uint)bVar11 * auVar211._0_4_ | (uint)!bVar11 * auVar213._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar214._4_4_ = (uint)bVar11 * auVar211._4_4_ | (uint)!bVar11 * auVar213._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar214._8_4_ = (uint)bVar11 * auVar211._8_4_ | (uint)!bVar11 * auVar213._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar214._12_4_ = (uint)bVar11 * auVar211._12_4_ | (uint)!bVar11 * auVar213._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar214._16_4_ = (uint)bVar11 * auVar211._16_4_ | (uint)!bVar11 * auVar213._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar214._20_4_ = (uint)bVar11 * auVar211._20_4_ | (uint)!bVar11 * auVar213._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar214._24_4_ = (uint)bVar11 * auVar211._24_4_ | (uint)!bVar11 * auVar213._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar214._28_4_ = (uint)bVar11 * auVar211._28_4_ | (uint)!bVar11 * auVar213._28_4_;
          bVar12 = (byte)(uVar13 >> 8);
          bVar11 = (bool)(bVar12 & 1);
          auVar214._32_4_ = (uint)bVar11 * auVar211._32_4_ | (uint)!bVar11 * auVar213._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar214._36_4_ = (uint)bVar11 * auVar211._36_4_ | (uint)!bVar11 * auVar213._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar214._40_4_ = (uint)bVar11 * auVar211._40_4_ | (uint)!bVar11 * auVar213._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar214._44_4_ = (uint)bVar11 * auVar211._44_4_ | (uint)!bVar11 * auVar213._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar214._48_4_ = (uint)bVar11 * auVar211._48_4_ | (uint)!bVar11 * auVar213._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar214._52_4_ = (uint)bVar11 * auVar211._52_4_ | (uint)!bVar11 * auVar213._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar214._56_4_ = (uint)bVar11 * auVar211._56_4_ | (uint)!bVar11 * auVar213._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar214._60_4_ = (uint)bVar11 * auVar211._60_4_ | (uint)!bVar11 * auVar213._60_4_;
          auVar211 = vmulps_avx512f(auVar214,auVar214);
          auVar213 = vfmadd132ps_avx512f(auVar214,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])_ps512_cephes_log_p2);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])_ps512_cephes_log_p3);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])_ps512_cephes_log_p4);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])_ps512_cephes_log_p5);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])_ps512_cephes_log_p6);
          auVar213 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])afVar136);
          in_ZMM20 = vfmadd213ps_avx512f(auVar213,auVar214,(undefined1  [64])afVar137);
          auVar213 = vmulps_avx512f(auVar211,auVar214);
          auVar213 = vfmadd213ps_avx512f(auVar213,in_ZMM20,auVar214);
          uVar14 = vcmpps_avx512f(auVar333,auVar334,2);
          auVar333 = vpsubd_avx512f(auVar210,auVar311);
          auVar333 = vcvtdq2ps_avx512f(auVar333);
          auVar210 = vaddps_avx512f(auVar333,(undefined1  [64])afVar126);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar215._0_4_ = (uint)bVar11 * auVar333._0_4_ | (uint)!bVar11 * auVar210._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar215._4_4_ = (uint)bVar11 * auVar333._4_4_ | (uint)!bVar11 * auVar210._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar215._8_4_ = (uint)bVar11 * auVar333._8_4_ | (uint)!bVar11 * auVar210._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar215._12_4_ = (uint)bVar11 * auVar333._12_4_ | (uint)!bVar11 * auVar210._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar215._16_4_ = (uint)bVar11 * auVar333._16_4_ | (uint)!bVar11 * auVar210._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar215._20_4_ = (uint)bVar11 * auVar333._20_4_ | (uint)!bVar11 * auVar210._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar215._24_4_ = (uint)bVar11 * auVar333._24_4_ | (uint)!bVar11 * auVar210._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar215._28_4_ = (uint)bVar11 * auVar333._28_4_ | (uint)!bVar11 * auVar210._28_4_;
          bVar11 = (bool)(bVar12 & 1);
          auVar215._32_4_ = (uint)bVar11 * auVar333._32_4_ | (uint)!bVar11 * auVar210._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar215._36_4_ = (uint)bVar11 * auVar333._36_4_ | (uint)!bVar11 * auVar210._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar215._40_4_ = (uint)bVar11 * auVar333._40_4_ | (uint)!bVar11 * auVar210._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar215._44_4_ = (uint)bVar11 * auVar333._44_4_ | (uint)!bVar11 * auVar210._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar215._48_4_ = (uint)bVar11 * auVar333._48_4_ | (uint)!bVar11 * auVar210._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar215._52_4_ = (uint)bVar11 * auVar333._52_4_ | (uint)!bVar11 * auVar210._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar215._56_4_ = (uint)bVar11 * auVar333._56_4_ | (uint)!bVar11 * auVar210._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar215._60_4_ = (uint)bVar11 * auVar333._60_4_ | (uint)!bVar11 * auVar210._60_4_;
          auVar333 = vfmadd231ps_avx512f(auVar213,auVar215,(undefined1  [64])afVar138);
          auVar333 = vfmadd231ps_avx512f(auVar333,auVar316,auVar211);
          in_ZMM21 = vfmadd231ps_avx512f(auVar333,(undefined1  [64])afVar139,auVar215);
          auVar333 = vmulps_avx512f(in_ZMM21,auVar331);
          auVar211 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar216._0_4_ = (uint)bVar11 * auVar211._0_4_ | (uint)!bVar11 * auVar333._0_4_;
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar216._4_4_ = (uint)bVar11 * auVar211._4_4_ | (uint)!bVar11 * auVar333._4_4_;
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar216._8_4_ = (uint)bVar11 * auVar211._8_4_ | (uint)!bVar11 * auVar333._8_4_;
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar216._12_4_ = (uint)bVar11 * auVar211._12_4_ | (uint)!bVar11 * auVar333._12_4_;
          bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar216._16_4_ = (uint)bVar11 * auVar211._16_4_ | (uint)!bVar11 * auVar333._16_4_;
          bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar216._20_4_ = (uint)bVar11 * auVar211._20_4_ | (uint)!bVar11 * auVar333._20_4_;
          bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar216._24_4_ = (uint)bVar11 * auVar211._24_4_ | (uint)!bVar11 * auVar333._24_4_;
          bVar11 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar216._28_4_ = (uint)bVar11 * auVar211._28_4_ | (uint)!bVar11 * auVar333._28_4_;
          bVar11 = (bool)((byte)(uVar14 >> 8) & 1);
          auVar216._32_4_ = (uint)bVar11 * auVar211._32_4_ | (uint)!bVar11 * auVar333._32_4_;
          bVar11 = (bool)((byte)(uVar14 >> 9) & 1);
          auVar216._36_4_ = (uint)bVar11 * auVar211._36_4_ | (uint)!bVar11 * auVar333._36_4_;
          bVar11 = (bool)((byte)(uVar14 >> 10) & 1);
          auVar216._40_4_ = (uint)bVar11 * auVar211._40_4_ | (uint)!bVar11 * auVar333._40_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xb) & 1);
          auVar216._44_4_ = (uint)bVar11 * auVar211._44_4_ | (uint)!bVar11 * auVar333._44_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xc) & 1);
          auVar216._48_4_ = (uint)bVar11 * auVar211._48_4_ | (uint)!bVar11 * auVar333._48_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xd) & 1);
          auVar216._52_4_ = (uint)bVar11 * auVar211._52_4_ | (uint)!bVar11 * auVar333._52_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xe) & 1);
          auVar216._56_4_ = (uint)bVar11 * auVar211._56_4_ | (uint)!bVar11 * auVar333._56_4_;
          bVar11 = SUB81(uVar14 >> 0xf,0);
          auVar216._60_4_ = (uint)bVar11 * auVar211._60_4_ | (uint)!bVar11 * auVar333._60_4_;
          auVar333 = vminps_avx512f(auVar216,(undefined1  [64])afVar127);
          auVar333 = vmaxps_avx512f(auVar333,(undefined1  [64])afVar128);
          auVar211 = vfmadd213ps_avx512f((undefined1  [64])afVar129,auVar333,
                                         (undefined1  [64])afVar135);
          auVar210 = vrndscaleps_avx512f(auVar211,1);
          uVar13 = vcmpps_avx512f(auVar211,auVar210,1);
          auVar211 = vsubps_avx512f(auVar210,(undefined1  [64])afVar126);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM18._0_4_ = (uint)bVar11 * auVar211._0_4_ | (uint)!bVar11 * auVar210._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM18._4_4_ = (uint)bVar11 * auVar211._4_4_ | (uint)!bVar11 * auVar210._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM18._8_4_ = (uint)bVar11 * auVar211._8_4_ | (uint)!bVar11 * auVar210._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM18._12_4_ = (uint)bVar11 * auVar211._12_4_ | (uint)!bVar11 * auVar210._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM18._16_4_ = (uint)bVar11 * auVar211._16_4_ | (uint)!bVar11 * auVar210._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM18._20_4_ = (uint)bVar11 * auVar211._20_4_ | (uint)!bVar11 * auVar210._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM18._24_4_ = (uint)bVar11 * auVar211._24_4_ | (uint)!bVar11 * auVar210._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM18._28_4_ = (uint)bVar11 * auVar211._28_4_ | (uint)!bVar11 * auVar210._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM18._32_4_ = (uint)bVar11 * auVar211._32_4_ | (uint)!bVar11 * auVar210._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM18._36_4_ = (uint)bVar11 * auVar211._36_4_ | (uint)!bVar11 * auVar210._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM18._40_4_ = (uint)bVar11 * auVar211._40_4_ | (uint)!bVar11 * auVar210._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM18._44_4_ = (uint)bVar11 * auVar211._44_4_ | (uint)!bVar11 * auVar210._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM18._48_4_ = (uint)bVar11 * auVar211._48_4_ | (uint)!bVar11 * auVar210._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM18._52_4_ = (uint)bVar11 * auVar211._52_4_ | (uint)!bVar11 * auVar210._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM18._56_4_ = (uint)bVar11 * auVar211._56_4_ | (uint)!bVar11 * auVar210._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM18._60_4_ = (uint)bVar11 * auVar211._60_4_ | (uint)!bVar11 * auVar210._60_4_;
          auVar333 = vfmadd231ps_avx512f(auVar333,in_ZMM18,auVar326);
          auVar333 = vfmadd231ps_avx512f(auVar333,in_ZMM18,auVar306);
          auVar211 = vmulps_avx512f(auVar333,auVar333);
          auVar210 = vfmadd213ps_avx512f(auVar333,(undefined1  [64])afVar130,
                                         (undefined1  [64])afVar131);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar132);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar133);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar134);
          auVar210 = vfmadd213ps_avx512f(auVar210,auVar333,(undefined1  [64])afVar135);
          in_ZMM19 = vfmadd213ps_avx512f(auVar210,auVar211,auVar333);
          auVar333 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar126);
          auVar211 = vcvttps2dq_avx512f(in_ZMM18);
          auVar211 = vpaddd_avx512f(auVar211,auVar311);
          auVar211 = vpslld_avx512f(auVar211,0x17);
          auVar333 = vfmadd213ps_avx512f(auVar211,auVar333,auVar321);
          auVar211 = vrcp14ps_avx512f(auVar333);
          auVar333 = vfmsub213ps_avx512f(auVar333,auVar211,auVar321);
          auVar333 = vfnmadd132ps_avx512vl(auVar333,auVar211,auVar211);
          in_ZMM17 = vfnmsub213ps_avx512f(auVar333,auVar331,auVar321);
          in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar332);
          break;
        case 6:
          auVar211 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          uVar141 = (*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar333._4_4_ = uVar141;
          auVar333._0_4_ = uVar141;
          auVar333._8_4_ = uVar141;
          auVar333._12_4_ = uVar141;
          auVar333._16_4_ = uVar141;
          auVar333._20_4_ = uVar141;
          auVar333._24_4_ = uVar141;
          auVar333._28_4_ = uVar141;
          auVar333._32_4_ = uVar141;
          auVar333._36_4_ = uVar141;
          auVar333._40_4_ = uVar141;
          auVar333._44_4_ = uVar141;
          auVar333._48_4_ = uVar141;
          auVar333._52_4_ = uVar141;
          auVar333._56_4_ = uVar141;
          auVar333._60_4_ = uVar141;
          auVar333 = vfmadd213ps_avx512f(auVar211,auVar332,auVar333);
          auVar333 = vmaxps_avx512f(auVar333,auVar334);
          auVar333 = vminps_avx512f(auVar333,auVar321);
          in_ZMM16 = vmulps_avx512f(auVar333,auVar332);
        }
        *(undefined1 (*) [64])((long)top_blob->data + uVar144 * 0x40) = in_ZMM16;
      }
    }
    else if (_elempack == 4) {
      local_308._0_8_ = this->_vptr_InnerProduct_x86_avx512;
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      iVar143 = local_360 * local_34c;
      iVar140 = *(int *)(&this->field_0xe0 + (long)p_Var6);
      local_328._0_8_ = p_Var6;
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar144 = 0;
      uVar148 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar148 = uVar144;
      }
      auVar219 = ZEXT816(0) << 0x40;
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar162 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar269._8_4_ = 0x3f000000;
      auVar269._0_8_ = 0x3f0000003f000000;
      auVar269._12_4_ = 0x3f000000;
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar283._8_4_ = 0x3f800000;
      auVar283._0_8_ = 0x3f8000003f800000;
      auVar283._12_4_ = 0x3f800000;
      auVar287._8_4_ = 0x3f318000;
      auVar287._0_8_ = 0x3f3180003f318000;
      auVar287._12_4_ = 0x3f318000;
      auVar297._8_4_ = 0x39506967;
      auVar297._0_8_ = 0x3950696739506967;
      auVar297._12_4_ = 0x39506967;
      auVar302._8_4_ = 0x3ab743ce;
      auVar302._0_8_ = 0x3ab743ce3ab743ce;
      auVar302._12_4_ = 0x3ab743ce;
      auVar307._8_4_ = 0x3c088908;
      auVar307._0_8_ = 0x3c0889083c088908;
      auVar307._12_4_ = 0x3c088908;
      auVar312._8_4_ = 0x3d2aa9c1;
      auVar312._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar312._12_4_ = 0x3d2aa9c1;
      auVar317._8_4_ = 0x3e2aaaaa;
      auVar317._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar317._12_4_ = 0x3e2aaaaa;
      auVar322._8_4_ = 0x3f800000;
      auVar322._0_8_ = 0x3f8000003f800000;
      auVar322._12_4_ = 0x3f800000;
      auVar327._8_4_ = 0xb95e8083;
      auVar327._0_8_ = 0xb95e8083b95e8083;
      auVar327._12_4_ = 0xb95e8083;
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (; uVar144 != uVar148; uVar144 = uVar144 + 1) {
        if (lVar8 == 0) {
          auVar173 = ZEXT816(0) << 0x40;
        }
        else {
          auVar173 = *(undefined1 (*) [16])(lVar8 + uVar144 * 0x10);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar150 = (long)(this->weight_data_tm).w;
        pauVar159 = (undefined1 (*) [32])(uVar144 * lVar150 * sVar10 + (long)pvVar9);
        auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar145 = 0;
        iVar161 = 0;
        auVar169 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar169);
        auVar169 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar169);
        auVar169 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar169);
        pauVar146 = local_378;
        while( true ) {
          if (iVar143 <= iVar161 + 7) break;
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar146));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 4)));
          auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 8)));
          auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0xc)));
          auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar169),auVar170,1);
          auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar172,1);
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x10)));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x14)));
          auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x18)));
          auVar190 = vinsertf32x4_avx512vl(ZEXT1632(auVar169),auVar170,1);
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x1c)));
          auVar191 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar169,1);
          auVar186 = vlddqu_avx(*pauVar159);
          auVar187 = vlddqu_avx(pauVar159[1]);
          auVar192 = vcvtph2ps_avx512vl(auVar186._0_16_);
          auVar186 = vcvtph2ps_f16c(auVar186._16_16_);
          auVar193 = vcvtph2ps_avx512vl(auVar187._0_16_);
          auVar187 = vcvtph2ps_f16c(auVar187._16_16_);
          auVar188 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar188,auVar192);
          in_ZMM18 = ZEXT3264(auVar188);
          auVar186 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar189,auVar186);
          in_ZMM17 = ZEXT3264(auVar186);
          auVar186 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar190,auVar193);
          in_ZMM16 = ZEXT3264(auVar186);
          auVar186 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar191,auVar187);
          auVar301 = ZEXT3264(auVar186);
          pauVar146 = pauVar146 + 1;
          pauVar159 = pauVar159 + 2;
          iVar161 = iVar161 + 8;
          lVar145 = lVar145 + 8;
        }
        while( true ) {
          if (iVar143 <= iVar161 + 3) break;
          uVar2 = *(undefined4 *)*pauVar146;
          auVar189._4_4_ = uVar2;
          auVar189._0_4_ = uVar2;
          auVar189._8_4_ = uVar2;
          auVar189._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar146 + 4);
          auVar189._20_4_ = uVar2;
          auVar189._16_4_ = uVar2;
          auVar189._24_4_ = uVar2;
          auVar189._28_4_ = uVar2;
          auVar169 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 8)));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0xc)));
          auVar187 = vinsertf32x4_avx512vl(ZEXT1632(auVar169),auVar170,1);
          auVar186 = vlddqu_avx(*pauVar159);
          auVar188 = vcvtph2ps_avx512vl(auVar186._0_16_);
          auVar186 = vcvtph2ps_f16c(auVar186._16_16_);
          auVar188 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar189,auVar188);
          in_ZMM18 = ZEXT3264(auVar188);
          auVar186 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar187,auVar186);
          in_ZMM17 = ZEXT3264(auVar186);
          pauVar146 = (undefined1 (*) [32])(*pauVar146 + 0x10);
          pauVar159 = pauVar159 + 1;
          iVar161 = iVar161 + 4;
          lVar145 = lVar145 + 4;
        }
        for (; (int)lVar145 < iVar143; lVar145 = lVar145 + 1) {
          auVar169._8_8_ = 0;
          auVar169._0_8_ = *(ulong *)((long)pvVar9 + lVar145 * 8 + sVar10 * uVar144 * lVar150);
          auVar169 = vcvtph2ps_f16c(auVar169);
          uVar2 = *(undefined4 *)(*local_378 + lVar145 * 4);
          auVar170._4_4_ = uVar2;
          auVar170._0_4_ = uVar2;
          auVar170._8_4_ = uVar2;
          auVar170._12_4_ = uVar2;
          auVar173 = vfmadd231ps_avx512vl(auVar173,auVar169,auVar170);
        }
        auVar186 = vaddps_avx512vl(in_ZMM16._0_32_,auVar301._0_32_);
        auVar187 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM18._0_32_);
        fVar217 = auVar186._4_4_ + auVar187._4_4_;
        auVar171._0_4_ =
             auVar186._16_4_ + auVar187._16_4_ + auVar186._0_4_ + auVar187._0_4_ + auVar173._0_4_;
        auVar171._4_4_ = fVar217 + fVar217 + auVar173._4_4_;
        auVar171._8_4_ =
             auVar186._24_4_ + auVar187._24_4_ + auVar186._8_4_ + auVar187._8_4_ + auVar173._8_4_;
        auVar171._12_4_ =
             auVar186._28_4_ + auVar187._28_4_ + auVar186._12_4_ + auVar187._12_4_ + auVar173._12_4_
        ;
        auVar173 = auVar171;
        if (iVar140 - 1U < 6) {
          auVar173 = vmaxps_avx(auVar171,auVar219);
          switch(iVar140) {
          case 2:
            auVar169 = vminps_avx(auVar171,auVar219);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar61._4_4_ = uVar2;
            auVar61._0_4_ = uVar2;
            auVar61._8_4_ = uVar2;
            auVar61._12_4_ = uVar2;
            auVar173 = vfmadd231ps_avx512vl(auVar173,auVar169,auVar61);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar59._4_4_ = uVar2;
            auVar59._0_4_ = uVar2;
            auVar59._8_4_ = uVar2;
            auVar59._12_4_ = uVar2;
            auVar173 = vmaxps_avx512vl(auVar171,auVar59);
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar60._4_4_ = uVar2;
            auVar60._0_4_ = uVar2;
            auVar60._8_4_ = uVar2;
            auVar60._12_4_ = uVar2;
            auVar173 = vminps_avx512vl(auVar173,auVar60);
            break;
          case 4:
            auVar57._8_4_ = 0x80000000;
            auVar57._0_8_ = 0x8000000080000000;
            auVar57._12_4_ = 0x80000000;
            auVar173 = vxorps_avx512vl(auVar171,auVar57);
            auVar173 = vminps_avx512vl(auVar173,auVar163);
            auVar169 = vmaxps_avx512vl(auVar173,auVar162);
            auVar170 = vfmadd231ps_avx512vl(auVar269,auVar169,auVar164);
            auVar260._0_4_ = (int)auVar170._0_4_;
            auVar260._4_4_ = (int)auVar170._4_4_;
            auVar260._8_4_ = (int)auVar170._8_4_;
            auVar260._12_4_ = (int)auVar170._12_4_;
            auVar173 = vcvtdq2ps_avx(auVar260);
            uVar13 = vcmpps_avx512vl(auVar170,auVar173,1);
            auVar170 = vsubps_avx512vl(auVar173,auVar283);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar179._0_4_ = (float)((uint)bVar11 * auVar170._0_4_ | (uint)!bVar11 * auVar173._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar179._4_4_ = (float)((uint)bVar11 * auVar170._4_4_ | (uint)!bVar11 * auVar173._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar179._8_4_ = (float)((uint)bVar11 * auVar170._8_4_ | (uint)!bVar11 * auVar173._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar179._12_4_ =
                 (float)((uint)bVar11 * auVar170._12_4_ | (uint)!bVar11 * auVar173._12_4_);
            auVar173 = vfmsub231ps_fma(auVar169,auVar179,auVar287);
            auVar58._8_4_ = 0x395e8083;
            auVar58._0_8_ = 0x395e8083395e8083;
            auVar58._12_4_ = 0x395e8083;
            auVar169 = vfmsub231ps_avx512vl(auVar173,auVar179,auVar58);
            auVar239._0_4_ = auVar169._0_4_ * auVar169._0_4_;
            auVar239._4_4_ = auVar169._4_4_ * auVar169._4_4_;
            auVar239._8_4_ = auVar169._8_4_ * auVar169._8_4_;
            auVar239._12_4_ = auVar169._12_4_ * auVar169._12_4_;
            auVar173 = vfmadd213ps_fma(auVar297,auVar169,auVar302);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar307);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar312);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar317);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar269);
            auVar173 = vfmadd213ps_fma(auVar173,auVar239,auVar169);
            auVar225._0_4_ = auVar173._0_4_ + 1.0;
            auVar225._4_4_ = auVar173._4_4_ + 1.0;
            auVar225._8_4_ = auVar173._8_4_ + 1.0;
            auVar225._12_4_ = auVar173._12_4_ + 1.0;
            auVar240._0_4_ = (int)auVar179._0_4_;
            auVar240._4_4_ = (int)auVar179._4_4_;
            auVar240._8_4_ = (int)auVar179._8_4_;
            auVar240._12_4_ = (int)auVar179._12_4_;
            auVar173 = vpslld_avx(auVar240,0x17);
            auVar173 = vpaddd_avx(auVar322,auVar173);
            auVar169 = vfmadd213ps_fma(auVar173,auVar225,auVar283);
            auVar173 = vrcpps_avx(auVar169);
            auVar169 = vfmsub213ps_fma(auVar169,auVar173,auVar283);
            auVar173 = vfnmadd132ps_fma(auVar169,auVar173,auVar173);
            break;
          case 5:
            auVar173 = vminps_avx512vl(auVar171,auVar163);
            auVar170 = vmaxps_avx512vl(auVar173,auVar162);
            auVar169 = vfmadd213ps_fma(auVar164,auVar170,auVar269);
            auVar276._0_4_ = (int)auVar169._0_4_;
            auVar276._4_4_ = (int)auVar169._4_4_;
            auVar276._8_4_ = (int)auVar169._8_4_;
            auVar276._12_4_ = (int)auVar169._12_4_;
            auVar173 = vcvtdq2ps_avx(auVar276);
            uVar13 = vcmpps_avx512vl(auVar169,auVar173,1);
            auVar169 = vsubps_avx512vl(auVar173,auVar283);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar174._0_4_ = (float)((uint)bVar11 * auVar169._0_4_ | (uint)!bVar11 * auVar173._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar174._4_4_ = (float)((uint)bVar11 * auVar169._4_4_ | (uint)!bVar11 * auVar173._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar174._8_4_ = (float)((uint)bVar11 * auVar169._8_4_ | (uint)!bVar11 * auVar173._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar174._12_4_ =
                 (float)((uint)bVar11 * auVar169._12_4_ | (uint)!bVar11 * auVar173._12_4_);
            auVar173 = vfmsub231ps_fma(auVar170,auVar174,auVar287);
            auVar169 = vfnmsub231ps_fma(auVar173,auVar174,auVar327);
            auVar255._0_4_ = auVar169._0_4_ * auVar169._0_4_;
            auVar255._4_4_ = auVar169._4_4_ * auVar169._4_4_;
            auVar255._8_4_ = auVar169._8_4_ * auVar169._8_4_;
            auVar255._12_4_ = auVar169._12_4_ * auVar169._12_4_;
            auVar173 = vfmadd213ps_fma(auVar297,auVar169,auVar302);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar307);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar312);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar317);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar269);
            auVar173 = vfmadd213ps_fma(auVar173,auVar255,auVar169);
            auVar236._0_4_ = auVar173._0_4_ + 1.0;
            auVar236._4_4_ = auVar173._4_4_ + 1.0;
            auVar236._8_4_ = auVar173._8_4_ + 1.0;
            auVar236._12_4_ = auVar173._12_4_ + 1.0;
            auVar256._0_4_ = (int)auVar174._0_4_;
            auVar256._4_4_ = (int)auVar174._4_4_;
            auVar256._8_4_ = (int)auVar174._8_4_;
            auVar256._12_4_ = (int)auVar174._12_4_;
            auVar173 = vpslld_avx(auVar256,0x17);
            auVar173 = vpaddd_avx(auVar322,auVar173);
            auVar173 = vfmadd213ps_fma(auVar173,auVar236,auVar283);
            uVar13 = vcmpps_avx512vl(auVar173,auVar219,2);
            auVar47._8_4_ = 0x800000;
            auVar47._0_8_ = 0x80000000800000;
            auVar47._12_4_ = 0x800000;
            auVar173 = vmaxps_avx512vl(auVar173,auVar47);
            auVar170 = vpsrld_avx(auVar173,0x17);
            auVar277._8_4_ = 0x807fffff;
            auVar277._0_8_ = 0x807fffff807fffff;
            auVar277._12_4_ = 0x807fffff;
            auVar48._8_4_ = 0x3f000000;
            auVar48._0_8_ = 0x3f0000003f000000;
            auVar48._12_4_ = 0x3f000000;
            auVar173 = vpternlogd_avx512vl(auVar173,auVar277,auVar48,0xea);
            auVar49._8_4_ = 0x3f3504f3;
            auVar49._0_8_ = 0x3f3504f33f3504f3;
            auVar49._12_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar173,auVar49,1);
            auVar50._8_4_ = 0xbf800000;
            auVar50._0_8_ = 0xbf800000bf800000;
            auVar50._12_4_ = 0xbf800000;
            auVar169 = vaddps_avx512vl(auVar173,auVar50);
            auVar173 = vaddps_avx512vl(auVar169,auVar173);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar175._0_4_ = (float)((uint)bVar11 * auVar173._0_4_ | (uint)!bVar11 * auVar169._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar175._4_4_ = (float)((uint)bVar11 * auVar173._4_4_ | (uint)!bVar11 * auVar169._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar175._8_4_ = (float)((uint)bVar11 * auVar173._8_4_ | (uint)!bVar11 * auVar169._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar175._12_4_ =
                 (float)((uint)bVar11 * auVar173._12_4_ | (uint)!bVar11 * auVar169._12_4_);
            auVar237._0_4_ = auVar175._0_4_ * auVar175._0_4_;
            auVar237._4_4_ = auVar175._4_4_ * auVar175._4_4_;
            auVar237._8_4_ = auVar175._8_4_ * auVar175._8_4_;
            auVar237._12_4_ = auVar175._12_4_ * auVar175._12_4_;
            auVar291._8_4_ = 0x3d9021bb;
            auVar291._0_8_ = 0x3d9021bb3d9021bb;
            auVar291._12_4_ = 0x3d9021bb;
            auVar51._8_4_ = 0xbdebd1b8;
            auVar51._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar51._12_4_ = 0xbdebd1b8;
            auVar173 = vfmadd213ps_avx512vl(auVar291,auVar175,auVar51);
            auVar52._8_4_ = 0x3def251a;
            auVar52._0_8_ = 0x3def251a3def251a;
            auVar52._12_4_ = 0x3def251a;
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar52);
            auVar53._8_4_ = 0xbdfe5d4f;
            auVar53._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar53._12_4_ = 0xbdfe5d4f;
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar53);
            auVar54._8_4_ = 0x3e11e9bf;
            auVar54._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar54._12_4_ = 0x3e11e9bf;
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar54);
            auVar55._8_4_ = 0xbe2aae50;
            auVar55._0_8_ = 0xbe2aae50be2aae50;
            auVar55._12_4_ = 0xbe2aae50;
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar55);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar165);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar166);
            auVar173 = vfmadd213ps_avx512vl(auVar173,auVar175,auVar167);
            auVar169 = vmulps_avx512vl(auVar237,auVar175);
            in_ZMM16 = ZEXT1664(auVar169);
            auVar169 = vmulps_avx512vl(auVar169,auVar173);
            auVar56._8_4_ = 0xffffff82;
            auVar56._0_8_ = 0xffffff82ffffff82;
            auVar56._12_4_ = 0xffffff82;
            auVar173 = vpaddd_avx512vl(auVar170,auVar56);
            auVar173 = vcvtdq2ps_avx(auVar173);
            auVar170 = vsubps_avx512vl(auVar173,auVar283);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar176._0_4_ = (uint)bVar11 * auVar170._0_4_ | (uint)!bVar11 * auVar173._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar176._4_4_ = (uint)bVar11 * auVar170._4_4_ | (uint)!bVar11 * auVar173._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar176._8_4_ = (uint)bVar11 * auVar170._8_4_ | (uint)!bVar11 * auVar173._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar176._12_4_ = (uint)bVar11 * auVar170._12_4_ | (uint)!bVar11 * auVar173._12_4_;
            auVar173 = vfmadd231ps_fma(auVar169,auVar176,auVar327);
            auVar173 = vfmsub231ps_fma(auVar173,auVar269,auVar237);
            auVar173 = vsubps_avx(auVar173,auVar175);
            auVar173 = vfnmadd231ps_fma(auVar173,auVar287,auVar176);
            auVar169 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar177._0_4_ =
                 (uint)bVar11 * auVar169._0_4_ |
                 (uint)!bVar11 * (int)(auVar173._0_4_ + auVar173._0_4_);
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar177._4_4_ =
                 (uint)bVar11 * auVar169._4_4_ |
                 (uint)!bVar11 * (int)(auVar173._4_4_ + auVar173._4_4_);
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar177._8_4_ =
                 (uint)bVar11 * auVar169._8_4_ |
                 (uint)!bVar11 * (int)(auVar173._8_4_ + auVar173._8_4_);
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar177._12_4_ =
                 (uint)bVar11 * auVar169._12_4_ |
                 (uint)!bVar11 * (int)(auVar173._12_4_ + auVar173._12_4_);
            auVar173 = vminps_avx512vl(auVar177,auVar163);
            auVar170 = vmaxps_avx512vl(auVar173,auVar162);
            auVar169 = vfmadd213ps_fma(auVar164,auVar170,auVar269);
            auVar278._0_4_ = (int)auVar169._0_4_;
            auVar278._4_4_ = (int)auVar169._4_4_;
            auVar278._8_4_ = (int)auVar169._8_4_;
            auVar278._12_4_ = (int)auVar169._12_4_;
            auVar173 = vcvtdq2ps_avx(auVar278);
            uVar13 = vcmpps_avx512vl(auVar169,auVar173,1);
            auVar169 = vsubps_avx512vl(auVar173,auVar283);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar178._0_4_ = (float)((uint)bVar11 * auVar169._0_4_ | (uint)!bVar11 * auVar173._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar178._4_4_ = (float)((uint)bVar11 * auVar169._4_4_ | (uint)!bVar11 * auVar173._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar178._8_4_ = (float)((uint)bVar11 * auVar169._8_4_ | (uint)!bVar11 * auVar173._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar178._12_4_ =
                 (float)((uint)bVar11 * auVar169._12_4_ | (uint)!bVar11 * auVar173._12_4_);
            auVar173 = vfmsub231ps_fma(auVar170,auVar178,auVar287);
            auVar169 = vfnmsub231ps_fma(auVar173,auVar178,auVar327);
            auVar257._0_4_ = auVar169._0_4_ * auVar169._0_4_;
            auVar257._4_4_ = auVar169._4_4_ * auVar169._4_4_;
            auVar257._8_4_ = auVar169._8_4_ * auVar169._8_4_;
            auVar257._12_4_ = auVar169._12_4_ * auVar169._12_4_;
            auVar173 = vfmadd213ps_fma(auVar297,auVar169,auVar302);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar307);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar312);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar317);
            auVar173 = vfmadd213ps_fma(auVar173,auVar169,auVar269);
            auVar173 = vfmadd213ps_fma(auVar173,auVar257,auVar169);
            auVar238._0_4_ = auVar173._0_4_ + 1.0;
            auVar238._4_4_ = auVar173._4_4_ + 1.0;
            auVar238._8_4_ = auVar173._8_4_ + 1.0;
            auVar238._12_4_ = auVar173._12_4_ + 1.0;
            auVar258._0_4_ = (int)auVar178._0_4_;
            auVar258._4_4_ = (int)auVar178._4_4_;
            auVar258._8_4_ = (int)auVar178._8_4_;
            auVar258._12_4_ = (int)auVar178._12_4_;
            auVar173 = vpslld_avx(auVar258,0x17);
            auVar173 = vpaddd_avx(auVar322,auVar173);
            auVar169 = vfmadd213ps_fma(auVar173,auVar238,auVar283);
            auVar173 = vrcpps_avx(auVar169);
            auVar259._0_4_ = auVar173._0_4_ + auVar173._0_4_;
            auVar259._4_4_ = auVar173._4_4_ + auVar173._4_4_;
            auVar259._8_4_ = auVar173._8_4_ + auVar173._8_4_;
            auVar259._12_4_ = auVar173._12_4_ + auVar173._12_4_;
            auVar169 = vfmsub213ps_avx512vl(auVar169,auVar259,auVar168);
            auVar173 = vfnmadd213ps_fma(auVar169,auVar173,auVar259);
            auVar173 = vfmsub213ps_fma(auVar173,auVar171,auVar171);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar241._4_4_ = uVar2;
            auVar241._0_4_ = uVar2;
            auVar241._8_4_ = uVar2;
            auVar241._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar172._4_4_ = uVar2;
            auVar172._0_4_ = uVar2;
            auVar172._8_4_ = uVar2;
            auVar172._12_4_ = uVar2;
            auVar173 = vfmadd213ps_avx512vl(auVar241,auVar171,auVar172);
            auVar173 = vmaxps_avx(auVar173,auVar219);
            auVar169 = vminps_avx(auVar173,auVar283);
            auVar173._0_4_ = auVar169._0_4_ * auVar171._0_4_;
            auVar173._4_4_ = auVar169._4_4_ * auVar171._4_4_;
            auVar173._8_4_ = auVar169._8_4_ * auVar171._8_4_;
            auVar173._12_4_ = auVar169._12_4_ * auVar171._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar144 * 0x10) = auVar173;
      }
    }
    else if (_elempack == 8) {
      local_308._0_8_ = this->_vptr_InnerProduct_x86_avx512;
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      iVar143 = local_360 * local_34c;
      iVar140 = *(int *)(&this->field_0xe0 + (long)p_Var6);
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar144 = 0;
      uVar148 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar148 = uVar144;
      }
      auVar163 = ZEXT816(0) << 0x40;
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar266._8_4_ = 0xc2b0c0a5;
      auVar266._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar266._12_4_ = 0xc2b0c0a5;
      auVar266._16_4_ = 0xc2b0c0a5;
      auVar266._20_4_ = 0xc2b0c0a5;
      auVar266._24_4_ = 0xc2b0c0a5;
      auVar266._28_4_ = 0xc2b0c0a5;
      auVar273._8_4_ = 0x3f000000;
      auVar273._0_8_ = 0x3f0000003f000000;
      auVar273._12_4_ = 0x3f000000;
      auVar273._16_4_ = 0x3f000000;
      auVar273._20_4_ = 0x3f000000;
      auVar273._24_4_ = 0x3f000000;
      auVar273._28_4_ = 0x3f000000;
      auVar280._8_4_ = 0x3fb8aa3b;
      auVar280._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar280._12_4_ = 0x3fb8aa3b;
      auVar280._16_4_ = 0x3fb8aa3b;
      auVar280._20_4_ = 0x3fb8aa3b;
      auVar280._24_4_ = 0x3fb8aa3b;
      auVar280._28_4_ = 0x3fb8aa3b;
      auVar285._8_4_ = 0x3f800000;
      auVar285._0_8_ = 0x3f8000003f800000;
      auVar285._12_4_ = 0x3f800000;
      auVar285._16_4_ = 0x3f800000;
      auVar285._20_4_ = 0x3f800000;
      auVar285._24_4_ = 0x3f800000;
      auVar285._28_4_ = 0x3f800000;
      auVar289._8_4_ = 0x3f318000;
      auVar289._0_8_ = 0x3f3180003f318000;
      auVar289._12_4_ = 0x3f318000;
      auVar289._16_4_ = 0x3f318000;
      auVar289._20_4_ = 0x3f318000;
      auVar289._24_4_ = 0x3f318000;
      auVar289._28_4_ = 0x3f318000;
      auVar299._8_4_ = 0x39506967;
      auVar299._0_8_ = 0x3950696739506967;
      auVar299._12_4_ = 0x39506967;
      auVar299._16_4_ = 0x39506967;
      auVar299._20_4_ = 0x39506967;
      auVar299._24_4_ = 0x39506967;
      auVar299._28_4_ = 0x39506967;
      auVar304._8_4_ = 0x3ab743ce;
      auVar304._0_8_ = 0x3ab743ce3ab743ce;
      auVar304._12_4_ = 0x3ab743ce;
      auVar304._16_4_ = 0x3ab743ce;
      auVar304._20_4_ = 0x3ab743ce;
      auVar304._24_4_ = 0x3ab743ce;
      auVar304._28_4_ = 0x3ab743ce;
      auVar309._8_4_ = 0x3c088908;
      auVar309._0_8_ = 0x3c0889083c088908;
      auVar309._12_4_ = 0x3c088908;
      auVar309._16_4_ = 0x3c088908;
      auVar309._20_4_ = 0x3c088908;
      auVar309._24_4_ = 0x3c088908;
      auVar309._28_4_ = 0x3c088908;
      auVar314._8_4_ = 0x3d2aa9c1;
      auVar314._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar314._12_4_ = 0x3d2aa9c1;
      auVar314._16_4_ = 0x3d2aa9c1;
      auVar314._20_4_ = 0x3d2aa9c1;
      auVar314._24_4_ = 0x3d2aa9c1;
      auVar314._28_4_ = 0x3d2aa9c1;
      auVar319._8_4_ = 0x3e2aaaaa;
      auVar319._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar319._12_4_ = 0x3e2aaaaa;
      auVar319._16_4_ = 0x3e2aaaaa;
      auVar319._20_4_ = 0x3e2aaaaa;
      auVar319._24_4_ = 0x3e2aaaaa;
      auVar319._28_4_ = 0x3e2aaaaa;
      auVar324._8_4_ = 0x3f800000;
      auVar324._0_8_ = 0x3f8000003f800000;
      auVar324._12_4_ = 0x3f800000;
      auVar324._16_4_ = 0x3f800000;
      auVar324._20_4_ = 0x3f800000;
      auVar324._24_4_ = 0x3f800000;
      auVar324._28_4_ = 0x3f800000;
      auVar329._8_4_ = 0xb95e8083;
      auVar329._0_8_ = 0xb95e8083b95e8083;
      auVar329._12_4_ = 0xb95e8083;
      auVar329._16_4_ = 0xb95e8083;
      auVar329._20_4_ = 0xb95e8083;
      auVar329._24_4_ = 0xb95e8083;
      auVar329._28_4_ = 0xb95e8083;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar190 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar191 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar192 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar194 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (; uVar144 != uVar148; uVar144 = uVar144 + 1) {
        auVar326 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar301 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar144 * 0x20));
        }
        pauVar159 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar144 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        lVar145 = 0;
        iVar161 = 0;
        auVar162 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar162);
        pauVar146 = local_378;
        while( true ) {
          if (iVar143 <= iVar161 + 7) break;
          auVar196 = vlddqu_avx(*pauVar159);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)*pauVar146;
          auVar62._4_4_ = uVar2;
          auVar62._0_4_ = uVar2;
          auVar62._8_4_ = uVar2;
          auVar62._12_4_ = uVar2;
          auVar62._16_4_ = uVar2;
          auVar62._20_4_ = uVar2;
          auVar62._24_4_ = uVar2;
          auVar62._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar195,auVar62);
          auVar301 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 4);
          auVar63._4_4_ = uVar2;
          auVar63._0_4_ = uVar2;
          auVar63._8_4_ = uVar2;
          auVar63._12_4_ = uVar2;
          auVar63._16_4_ = uVar2;
          auVar63._20_4_ = uVar2;
          auVar63._24_4_ = uVar2;
          auVar63._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar196,auVar63);
          in_ZMM23 = ZEXT3264(auVar196);
          auVar196 = vlddqu_avx(pauVar159[1]);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 8);
          auVar64._4_4_ = uVar2;
          auVar64._0_4_ = uVar2;
          auVar64._8_4_ = uVar2;
          auVar64._12_4_ = uVar2;
          auVar64._16_4_ = uVar2;
          auVar64._20_4_ = uVar2;
          auVar64._24_4_ = uVar2;
          auVar64._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar195,auVar64);
          in_ZMM20 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar65._4_4_ = uVar2;
          auVar65._0_4_ = uVar2;
          auVar65._8_4_ = uVar2;
          auVar65._12_4_ = uVar2;
          auVar65._16_4_ = uVar2;
          auVar65._20_4_ = uVar2;
          auVar65._24_4_ = uVar2;
          auVar65._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar196,auVar65);
          in_ZMM18 = ZEXT3264(auVar196);
          auVar196 = vlddqu_avx(pauVar159[2]);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0x10);
          auVar66._4_4_ = uVar2;
          auVar66._0_4_ = uVar2;
          auVar66._8_4_ = uVar2;
          auVar66._12_4_ = uVar2;
          auVar66._16_4_ = uVar2;
          auVar66._20_4_ = uVar2;
          auVar66._24_4_ = uVar2;
          auVar66._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar195,auVar66);
          in_ZMM19 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0x14);
          auVar67._4_4_ = uVar2;
          auVar67._0_4_ = uVar2;
          auVar67._8_4_ = uVar2;
          auVar67._12_4_ = uVar2;
          auVar67._16_4_ = uVar2;
          auVar67._20_4_ = uVar2;
          auVar67._24_4_ = uVar2;
          auVar67._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar196,auVar67);
          in_ZMM17 = ZEXT3264(auVar196);
          auVar196 = vlddqu_avx(pauVar159[3]);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0x18);
          auVar68._4_4_ = uVar2;
          auVar68._0_4_ = uVar2;
          auVar68._8_4_ = uVar2;
          auVar68._12_4_ = uVar2;
          auVar68._16_4_ = uVar2;
          auVar68._20_4_ = uVar2;
          auVar68._24_4_ = uVar2;
          auVar68._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar195,auVar68);
          in_ZMM16 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0x1c);
          auVar69._4_4_ = uVar2;
          auVar69._0_4_ = uVar2;
          auVar69._8_4_ = uVar2;
          auVar69._12_4_ = uVar2;
          auVar69._16_4_ = uVar2;
          auVar69._20_4_ = uVar2;
          auVar69._24_4_ = uVar2;
          auVar69._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(auVar326._0_32_,auVar196,auVar69);
          auVar326 = ZEXT3264(auVar196);
          pauVar146 = pauVar146 + 1;
          pauVar159 = pauVar159 + 4;
          iVar161 = iVar161 + 8;
          lVar145 = lVar145 + 8;
        }
        while( true ) {
          if (iVar143 <= iVar161 + 3) break;
          auVar196 = vlddqu_avx(*pauVar159);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)*pauVar146;
          auVar70._4_4_ = uVar2;
          auVar70._0_4_ = uVar2;
          auVar70._8_4_ = uVar2;
          auVar70._12_4_ = uVar2;
          auVar70._16_4_ = uVar2;
          auVar70._20_4_ = uVar2;
          auVar70._24_4_ = uVar2;
          auVar70._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar195,auVar70);
          auVar301 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 4);
          auVar71._4_4_ = uVar2;
          auVar71._0_4_ = uVar2;
          auVar71._8_4_ = uVar2;
          auVar71._12_4_ = uVar2;
          auVar71._16_4_ = uVar2;
          auVar71._20_4_ = uVar2;
          auVar71._24_4_ = uVar2;
          auVar71._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar196,auVar71);
          in_ZMM23 = ZEXT3264(auVar196);
          auVar196 = vlddqu_avx(pauVar159[1]);
          auVar195 = vcvtph2ps_avx512vl(auVar196._0_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 8);
          auVar72._4_4_ = uVar2;
          auVar72._0_4_ = uVar2;
          auVar72._8_4_ = uVar2;
          auVar72._12_4_ = uVar2;
          auVar72._16_4_ = uVar2;
          auVar72._20_4_ = uVar2;
          auVar72._24_4_ = uVar2;
          auVar72._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar195,auVar72);
          in_ZMM20 = ZEXT3264(auVar195);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar73._4_4_ = uVar2;
          auVar73._0_4_ = uVar2;
          auVar73._8_4_ = uVar2;
          auVar73._12_4_ = uVar2;
          auVar73._16_4_ = uVar2;
          auVar73._20_4_ = uVar2;
          auVar73._24_4_ = uVar2;
          auVar73._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar196,auVar73);
          in_ZMM18 = ZEXT3264(auVar196);
          pauVar146 = (undefined1 (*) [32])(*pauVar146 + 0x10);
          pauVar159 = pauVar159 + 2;
          iVar161 = iVar161 + 4;
          lVar145 = lVar145 + 4;
        }
        for (; (int)lVar145 < iVar143; lVar145 = lVar145 + 1) {
          auVar162 = vlddqu_avx(*(undefined1 (*) [16])*pauVar159);
          auVar196 = vcvtph2ps_f16c(auVar162);
          uVar2 = *(undefined4 *)(*local_378 + lVar145 * 4);
          auVar195._4_4_ = uVar2;
          auVar195._0_4_ = uVar2;
          auVar195._8_4_ = uVar2;
          auVar195._12_4_ = uVar2;
          auVar195._16_4_ = uVar2;
          auVar195._20_4_ = uVar2;
          auVar195._24_4_ = uVar2;
          auVar195._28_4_ = uVar2;
          auVar196 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar196,auVar195);
          auVar301 = ZEXT3264(auVar196);
          pauVar159 = (undefined1 (*) [32])(*pauVar159 + 0x10);
        }
        auVar196 = vaddps_avx512vl(in_ZMM16._0_32_,auVar326._0_32_);
        auVar195 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM19._0_32_);
        auVar197 = vaddps_avx512vl(in_ZMM18._0_32_,in_ZMM20._0_32_);
        auVar197 = vaddps_avx512vl(auVar197,in_ZMM23._0_32_);
        auVar232._0_4_ = auVar197._0_4_ + auVar195._0_4_ + auVar196._0_4_ + auVar301._0_4_;
        auVar232._4_4_ = auVar197._4_4_ + auVar195._4_4_ + auVar196._4_4_ + auVar301._4_4_;
        auVar232._8_4_ = auVar197._8_4_ + auVar195._8_4_ + auVar196._8_4_ + auVar301._8_4_;
        auVar232._12_4_ = auVar197._12_4_ + auVar195._12_4_ + auVar196._12_4_ + auVar301._12_4_;
        auVar232._16_4_ = auVar197._16_4_ + auVar195._16_4_ + auVar196._16_4_ + auVar301._16_4_;
        auVar232._20_4_ = auVar197._20_4_ + auVar195._20_4_ + auVar196._20_4_ + auVar301._20_4_;
        auVar232._24_4_ = auVar197._24_4_ + auVar195._24_4_ + auVar196._24_4_ + auVar301._24_4_;
        auVar232._28_4_ = auVar197._28_4_ + auVar195._28_4_ + auVar196._28_4_ + auVar301._28_4_;
        auVar196 = auVar232;
        if (iVar140 - 1U < 6) {
          auVar196 = vmaxps_avx(auVar232,ZEXT1632(auVar163));
          switch(iVar140) {
          case 2:
            auVar195 = vminps_avx(auVar232,ZEXT1632(auVar163));
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar110._4_4_ = uVar2;
            auVar110._0_4_ = uVar2;
            auVar110._8_4_ = uVar2;
            auVar110._12_4_ = uVar2;
            auVar110._16_4_ = uVar2;
            auVar110._20_4_ = uVar2;
            auVar110._24_4_ = uVar2;
            auVar110._28_4_ = uVar2;
            auVar196 = vfmadd231ps_avx512vl(auVar196,auVar195,auVar110);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar108._4_4_ = uVar2;
            auVar108._0_4_ = uVar2;
            auVar108._8_4_ = uVar2;
            auVar108._12_4_ = uVar2;
            auVar108._16_4_ = uVar2;
            auVar108._20_4_ = uVar2;
            auVar108._24_4_ = uVar2;
            auVar108._28_4_ = uVar2;
            auVar196 = vmaxps_avx512vl(auVar232,auVar108);
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar109._4_4_ = uVar2;
            auVar109._0_4_ = uVar2;
            auVar109._8_4_ = uVar2;
            auVar109._12_4_ = uVar2;
            auVar109._16_4_ = uVar2;
            auVar109._20_4_ = uVar2;
            auVar109._24_4_ = uVar2;
            auVar109._28_4_ = uVar2;
            auVar196 = vminps_avx512vl(auVar196,auVar109);
            break;
          case 4:
            auVar106._8_4_ = 0x80000000;
            auVar106._0_8_ = 0x8000000080000000;
            auVar106._12_4_ = 0x80000000;
            auVar106._16_4_ = 0x80000000;
            auVar106._20_4_ = 0x80000000;
            auVar106._24_4_ = 0x80000000;
            auVar106._28_4_ = 0x80000000;
            auVar196 = vxorps_avx512vl(auVar232,auVar106);
            auVar196 = vminps_avx512vl(auVar196,auVar186);
            auVar196 = vmaxps_avx(auVar196,auVar266);
            auVar162 = vfmadd231ps_fma(auVar273,auVar196,auVar280);
            auVar195 = vroundps_avx(ZEXT1632(auVar162),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar195,1);
            auVar197 = vsubps_avx512vl(auVar195,auVar285);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar203._0_4_ = (float)((uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar195._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar203._4_4_ = (float)((uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar195._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar203._8_4_ = (float)((uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar195._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar203._12_4_ =
                 (float)((uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar195._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar203._16_4_ =
                 (float)((uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar195._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar203._20_4_ =
                 (float)((uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar195._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar203._24_4_ =
                 (float)((uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar195._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar203._28_4_ =
                 (float)((uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar195._28_4_);
            auVar162 = vfmsub231ps_fma(auVar196,auVar203,auVar289);
            auVar107._8_4_ = 0x395e8083;
            auVar107._0_8_ = 0x395e8083395e8083;
            auVar107._12_4_ = 0x395e8083;
            auVar107._16_4_ = 0x395e8083;
            auVar107._20_4_ = 0x395e8083;
            auVar107._24_4_ = 0x395e8083;
            auVar107._28_4_ = 0x395e8083;
            auVar196 = vfmsub231ps_avx512vl(ZEXT1632(auVar162),auVar203,auVar107);
            auVar247._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar247._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar247._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar247._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar247._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar247._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar247._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar247._28_4_ = 0;
            auVar195 = vfmadd213ps_avx512vl(auVar299,auVar196,auVar304);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar309);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar314);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar319);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar273);
            auVar196 = vfmadd213ps_avx512vl(auVar195,auVar247,auVar196);
            in_ZMM16 = ZEXT3264(auVar196);
            auVar195 = vaddps_avx512vl(auVar196,auVar285);
            auVar248._0_4_ = (int)auVar203._0_4_;
            auVar248._4_4_ = (int)auVar203._4_4_;
            auVar248._8_4_ = (int)auVar203._8_4_;
            auVar248._12_4_ = (int)auVar203._12_4_;
            auVar248._16_4_ = (int)auVar203._16_4_;
            auVar248._20_4_ = (int)auVar203._20_4_;
            auVar248._24_4_ = (int)auVar203._24_4_;
            auVar248._28_4_ = (int)auVar203._28_4_;
            auVar196 = vpslld_avx2(auVar248,0x17);
            auVar196 = vpaddd_avx2(auVar324,auVar196);
            auVar162 = vfmadd213ps_fma(auVar196,auVar195,auVar285);
            auVar196 = vrcpps_avx(ZEXT1632(auVar162));
            auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar196,auVar285);
            auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar196,auVar196);
            auVar196 = ZEXT1632(auVar162);
            break;
          case 5:
            auVar196 = vminps_avx512vl(auVar232,auVar186);
            auVar196 = vmaxps_avx(auVar196,auVar266);
            auVar162 = vfmadd213ps_fma(auVar280,auVar196,auVar273);
            auVar195 = vrndscaleps_avx512vl(ZEXT1632(auVar162),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar195,1);
            auVar197 = vsubps_avx512vl(auVar195,auVar285);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar198._0_4_ = (uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar195._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar198._4_4_ = (uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar195._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar198._8_4_ = (uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar195._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar198._12_4_ = (uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar195._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar198._16_4_ = (uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar195._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar198._20_4_ = (uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar195._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar198._24_4_ = (uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar195._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar198._28_4_ = (uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar195._28_4_;
            auVar196 = vfmsub231ps_avx512vl(auVar196,auVar198,auVar289);
            auVar196 = vfnmsub231ps_avx512vl(auVar196,auVar198,auVar329);
            auVar293._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar293._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar293._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar293._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar293._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar293._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar293._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar293._28_4_ = 0;
            auVar195 = vfmadd213ps_avx512vl(auVar299,auVar196,auVar304);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar309);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar314);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar319);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar273);
            auVar196 = vfmadd213ps_avx512vl(auVar195,auVar293,auVar196);
            auVar195 = vaddps_avx512vl(auVar196,auVar285);
            auVar196 = vcvttps2dq_avx512vl(auVar198);
            auVar196 = vpslld_avx2(auVar196,0x17);
            auVar196 = vpaddd_avx2(auVar196,auVar324);
            auVar162 = vfmadd213ps_fma(auVar196,auVar195,auVar285);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar162),ZEXT1632(auVar163),2);
            auVar99._8_4_ = 0x800000;
            auVar99._0_8_ = 0x80000000800000;
            auVar99._12_4_ = 0x800000;
            auVar99._16_4_ = 0x800000;
            auVar99._20_4_ = 0x800000;
            auVar99._24_4_ = 0x800000;
            auVar99._28_4_ = 0x800000;
            auVar196 = vmaxps_avx512vl(ZEXT1632(auVar162),auVar99);
            auVar294 = vpsrld_avx2(auVar196,0x17);
            auVar195 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
            auVar100._8_4_ = 0x3f000000;
            auVar100._0_8_ = 0x3f0000003f000000;
            auVar100._12_4_ = 0x3f000000;
            auVar100._16_4_ = 0x3f000000;
            auVar100._20_4_ = 0x3f000000;
            auVar100._24_4_ = 0x3f000000;
            auVar100._28_4_ = 0x3f000000;
            auVar196 = vpternlogd_avx512vl(auVar196,auVar195,auVar100,0xea);
            auVar101._8_4_ = 0x3f3504f3;
            auVar101._0_8_ = 0x3f3504f33f3504f3;
            auVar101._12_4_ = 0x3f3504f3;
            auVar101._16_4_ = 0x3f3504f3;
            auVar101._20_4_ = 0x3f3504f3;
            auVar101._24_4_ = 0x3f3504f3;
            auVar101._28_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar196,auVar101,1);
            auVar195 = vaddps_avx512vl(auVar196,auVar187);
            auVar196 = vaddps_avx512vl(auVar195,auVar196);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar199._0_4_ = (uint)bVar11 * auVar196._0_4_ | (uint)!bVar11 * auVar195._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar199._4_4_ = (uint)bVar11 * auVar196._4_4_ | (uint)!bVar11 * auVar195._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar199._8_4_ = (uint)bVar11 * auVar196._8_4_ | (uint)!bVar11 * auVar195._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar199._12_4_ = (uint)bVar11 * auVar196._12_4_ | (uint)!bVar11 * auVar195._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar199._16_4_ = (uint)bVar11 * auVar196._16_4_ | (uint)!bVar11 * auVar195._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar199._20_4_ = (uint)bVar11 * auVar196._20_4_ | (uint)!bVar11 * auVar195._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar199._24_4_ = (uint)bVar11 * auVar196._24_4_ | (uint)!bVar11 * auVar195._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar199._28_4_ = (uint)bVar11 * auVar196._28_4_ | (uint)!bVar11 * auVar195._28_4_;
            auVar195 = vmulps_avx512vl(auVar199,auVar199);
            auVar102._8_4_ = 0xbdebd1b8;
            auVar102._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar102._12_4_ = 0xbdebd1b8;
            auVar102._16_4_ = 0xbdebd1b8;
            auVar102._20_4_ = 0xbdebd1b8;
            auVar102._24_4_ = 0xbdebd1b8;
            auVar102._28_4_ = 0xbdebd1b8;
            auVar196 = vfmadd213ps_avx512vl(auVar188,auVar199,auVar102);
            auVar103._8_4_ = 0x3def251a;
            auVar103._0_8_ = 0x3def251a3def251a;
            auVar103._12_4_ = 0x3def251a;
            auVar103._16_4_ = 0x3def251a;
            auVar103._20_4_ = 0x3def251a;
            auVar103._24_4_ = 0x3def251a;
            auVar103._28_4_ = 0x3def251a;
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar103);
            auVar104._8_4_ = 0xbdfe5d4f;
            auVar104._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar104._12_4_ = 0xbdfe5d4f;
            auVar104._16_4_ = 0xbdfe5d4f;
            auVar104._20_4_ = 0xbdfe5d4f;
            auVar104._24_4_ = 0xbdfe5d4f;
            auVar104._28_4_ = 0xbdfe5d4f;
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar104);
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar189);
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar190);
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar191);
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar192);
            auVar196 = vfmadd213ps_avx512vl(auVar196,auVar199,auVar193);
            auVar197 = vmulps_avx512vl(auVar195,auVar199);
            in_ZMM18 = ZEXT3264(auVar197);
            auVar197 = vmulps_avx512vl(auVar197,auVar196);
            auVar105._8_4_ = 0xffffff82;
            auVar105._0_8_ = 0xffffff82ffffff82;
            auVar105._12_4_ = 0xffffff82;
            auVar105._16_4_ = 0xffffff82;
            auVar105._20_4_ = 0xffffff82;
            auVar105._24_4_ = 0xffffff82;
            auVar105._28_4_ = 0xffffff82;
            auVar196 = vpaddd_avx512vl(auVar294,auVar105);
            auVar196 = vcvtdq2ps_avx(auVar196);
            auVar294 = vsubps_avx512vl(auVar196,auVar285);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar200._0_4_ = (uint)bVar11 * auVar294._0_4_ | (uint)!bVar11 * auVar196._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar200._4_4_ = (uint)bVar11 * auVar294._4_4_ | (uint)!bVar11 * auVar196._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar200._8_4_ = (uint)bVar11 * auVar294._8_4_ | (uint)!bVar11 * auVar196._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar200._12_4_ = (uint)bVar11 * auVar294._12_4_ | (uint)!bVar11 * auVar196._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar200._16_4_ = (uint)bVar11 * auVar294._16_4_ | (uint)!bVar11 * auVar196._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar200._20_4_ = (uint)bVar11 * auVar294._20_4_ | (uint)!bVar11 * auVar196._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar200._24_4_ = (uint)bVar11 * auVar294._24_4_ | (uint)!bVar11 * auVar196._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar200._28_4_ = (uint)bVar11 * auVar294._28_4_ | (uint)!bVar11 * auVar196._28_4_;
            auVar196 = vfmadd231ps_avx512vl(auVar197,auVar200,auVar329);
            auVar196 = vfmsub231ps_avx512vl(auVar196,auVar273,auVar195);
            auVar196 = vsubps_avx512vl(auVar196,auVar199);
            auVar162 = vfmsub231ps_fma(auVar196,auVar289,auVar200);
            auVar196 = vmulps_avx512vl(ZEXT1632(auVar162),auVar194);
            auVar195 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar201._0_4_ = (uint)bVar11 * auVar195._0_4_ | (uint)!bVar11 * auVar196._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar201._4_4_ = (uint)bVar11 * auVar195._4_4_ | (uint)!bVar11 * auVar196._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar201._8_4_ = (uint)bVar11 * auVar195._8_4_ | (uint)!bVar11 * auVar196._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar201._12_4_ = (uint)bVar11 * auVar195._12_4_ | (uint)!bVar11 * auVar196._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar201._16_4_ = (uint)bVar11 * auVar195._16_4_ | (uint)!bVar11 * auVar196._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar201._20_4_ = (uint)bVar11 * auVar195._20_4_ | (uint)!bVar11 * auVar196._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar201._24_4_ = (uint)bVar11 * auVar195._24_4_ | (uint)!bVar11 * auVar196._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar201._28_4_ = (uint)bVar11 * auVar195._28_4_ | (uint)!bVar11 * auVar196._28_4_;
            auVar196 = vminps_avx512vl(auVar201,auVar186);
            auVar196 = vmaxps_avx(auVar196,auVar266);
            auVar162 = vfmadd213ps_fma(auVar280,auVar196,auVar273);
            auVar195 = vrndscaleps_avx512vl(ZEXT1632(auVar162),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar195,1);
            auVar197 = vsubps_avx512vl(auVar195,auVar285);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar202._0_4_ = (uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar195._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar202._4_4_ = (uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar195._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar202._8_4_ = (uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar195._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar202._12_4_ = (uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar195._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar202._16_4_ = (uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar195._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar202._20_4_ = (uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar195._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar202._24_4_ = (uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar195._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar202._28_4_ = (uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar195._28_4_;
            in_ZMM16 = ZEXT3264(auVar202);
            auVar196 = vfmsub231ps_avx512vl(auVar196,auVar202,auVar289);
            auVar196 = vfnmsub231ps_avx512vl(auVar196,auVar202,auVar329);
            auVar295._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar295._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar295._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar295._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar295._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar295._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar295._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar295._28_4_ = 0;
            auVar195 = vfmadd213ps_avx512vl(auVar299,auVar196,auVar304);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar309);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar314);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar319);
            auVar195 = vfmadd213ps_avx512vl(auVar195,auVar196,auVar273);
            auVar196 = vfmadd213ps_avx512vl(auVar195,auVar295,auVar196);
            in_ZMM17 = ZEXT3264(auVar196);
            auVar195 = vaddps_avx512vl(auVar196,auVar285);
            auVar196 = vcvttps2dq_avx512vl(auVar202);
            auVar196 = vpslld_avx2(auVar196,0x17);
            auVar196 = vpaddd_avx2(auVar196,auVar324);
            auVar162 = vfmadd213ps_fma(auVar196,auVar195,auVar285);
            auVar196 = vrcpps_avx(ZEXT1632(auVar162));
            auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar196,auVar285);
            auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar196,auVar196);
            auVar195 = vfnmadd213ps_avx512vl(ZEXT1632(auVar162),auVar194,auVar187);
            auVar196._4_4_ = auVar195._4_4_ * auVar232._4_4_;
            auVar196._0_4_ = auVar195._0_4_ * auVar232._0_4_;
            auVar196._8_4_ = auVar195._8_4_ * auVar232._8_4_;
            auVar196._12_4_ = auVar195._12_4_ * auVar232._12_4_;
            auVar196._16_4_ = auVar195._16_4_ * auVar232._16_4_;
            auVar196._20_4_ = auVar195._20_4_ * auVar232._20_4_;
            auVar196._24_4_ = auVar195._24_4_ * auVar232._24_4_;
            auVar196._28_4_ = auVar195._28_4_;
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar249._4_4_ = uVar2;
            auVar249._0_4_ = uVar2;
            auVar249._8_4_ = uVar2;
            auVar249._12_4_ = uVar2;
            auVar249._16_4_ = uVar2;
            auVar249._20_4_ = uVar2;
            auVar249._24_4_ = uVar2;
            auVar249._28_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar197._4_4_ = uVar2;
            auVar197._0_4_ = uVar2;
            auVar197._8_4_ = uVar2;
            auVar197._12_4_ = uVar2;
            auVar197._16_4_ = uVar2;
            auVar197._20_4_ = uVar2;
            auVar197._24_4_ = uVar2;
            auVar197._28_4_ = uVar2;
            auVar195 = vfmadd213ps_avx512vl(auVar249,auVar232,auVar197);
            auVar195 = vmaxps_avx(auVar195,ZEXT1632(auVar163));
            auVar195 = vminps_avx(auVar195,auVar285);
            auVar294._4_4_ = auVar195._4_4_ * auVar232._4_4_;
            auVar294._0_4_ = auVar195._0_4_ * auVar232._0_4_;
            auVar294._8_4_ = auVar195._8_4_ * auVar232._8_4_;
            auVar294._12_4_ = auVar195._12_4_ * auVar232._12_4_;
            auVar294._16_4_ = auVar195._16_4_ * auVar232._16_4_;
            auVar294._20_4_ = auVar195._20_4_ * auVar232._20_4_;
            auVar294._24_4_ = auVar195._24_4_ * auVar232._24_4_;
            auVar294._28_4_ = auVar196._28_4_;
            auVar196 = auVar294;
          }
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar144 * 0x20) = auVar196;
      }
    }
    else if (_elempack == 1) {
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      iVar140 = *(int *)(&this->field_0xe0 + (long)p_Var6);
      iVar143 = local_360 * local_34c;
      uVar141 = top_blob->w;
      local_2d0 = (ulong)(int)uVar141;
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar148 = 0;
      local_1a0 = (ulong)(uint)((int)uVar141 >> 3);
      if ((int)uVar141 >> 3 < 1) {
        local_1a0 = uVar148;
      }
      lVar145 = 7;
      lVar150 = 6;
      lVar151 = 5;
      lVar153 = 4;
      lVar155 = 3;
      lVar157 = 2;
      lVar160 = 1;
      for (uVar144 = 0; pauVar146 = local_378, uVar144 != local_1a0; uVar144 = uVar144 + 1) {
        local_2c8 = uVar144 * 8;
        auVar163 = ZEXT816(0) << 0x40;
        auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar301 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar144 * 0x20));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar142 = (long)(this->weight_data_tm).w;
        local_1c8._0_8_ = lVar142;
        lVar147 = 0;
        lVar149 = 0;
        auVar162 = ZEXT816(0) << 0x40;
        auVar164 = ZEXT816(0) << 0x40;
        auVar326 = ZEXT1664((undefined1  [16])0x0);
        auVar165 = ZEXT816(0) << 0x40;
        auVar166 = ZEXT816(0) << 0x40;
        local_328._0_16_ = ZEXT816(0);
        local_308._0_16_ = ZEXT816(0);
        iVar161 = 0;
        while( true ) {
          local_308 = ZEXT1632(local_308._0_16_);
          local_328 = ZEXT1632(local_328._0_16_);
          auVar331 = ZEXT1664(auVar166);
          auVar321 = ZEXT1664(auVar165);
          auVar316 = ZEXT1664(auVar164);
          auVar311 = ZEXT1664(auVar162);
          auVar306 = ZEXT1664(auVar163);
          local_138 = ZEXT1632(auVar163);
          local_158 = ZEXT1632(auVar162);
          local_178 = ZEXT1632(auVar164);
          local_198 = auVar326._0_32_;
          local_288 = ZEXT1632(auVar165);
          local_98 = ZEXT1632(auVar166);
          if (iVar143 <= iVar161 + 7) break;
          auVar186 = *(undefined1 (*) [32])(*local_378 + lVar149 * 2);
          auVar163 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * uVar148 * lVar142));
          auVar162 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar160 * lVar142));
          auVar164 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar157 * lVar142));
          auVar165 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar155 * lVar142));
          auVar166 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar153 * lVar142));
          auVar167 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar151 * lVar142));
          auVar168 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar150 * lVar142));
          auVar219 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar149 + sVar10 * lVar145 * lVar142));
          auVar187 = vcvtph2ps_f16c(auVar163);
          auVar188 = vcvtph2ps_f16c(auVar162);
          auVar189 = vcvtph2ps_f16c(auVar164);
          auVar190 = vcvtph2ps_f16c(auVar165);
          auVar191 = vcvtph2ps_f16c(auVar166);
          auVar192 = vcvtph2ps_f16c(auVar167);
          auVar193 = vcvtph2ps_f16c(auVar168);
          auVar194 = vcvtph2ps_f16c(auVar219);
          auVar163 = vfmadd231ps_fma(local_138,auVar186,auVar187);
          auVar162 = vfmadd231ps_fma(local_158,auVar186,auVar188);
          auVar164 = vfmadd231ps_fma(local_178,auVar186,auVar189);
          auVar165 = vfmadd231ps_fma(local_198,auVar186,auVar190);
          auVar326 = ZEXT1664(auVar165);
          auVar165 = vfmadd231ps_fma(local_288,auVar186,auVar191);
          auVar166 = vfmadd231ps_fma(local_98,auVar186,auVar192);
          local_328._0_16_ = vfmadd231ps_fma(local_328,auVar186,auVar193);
          local_308._0_16_ = vfmadd231ps_fma(local_308,auVar186,auVar194);
          iVar161 = iVar161 + 8;
          lVar149 = lVar149 + 0x10;
          lVar147 = lVar147 + 8;
        }
        lVar142 = sVar10 * lVar142;
        local_2c0 = lVar160;
        local_2b8 = lVar157;
        local_2b0 = lVar155;
        local_2a8 = lVar153;
        local_2a0 = lVar151;
        local_298 = lVar150;
        local_290 = lVar145;
        for (; (int)lVar147 < iVar143; lVar147 = lVar147 + 1) {
          local_1c8 = auVar301._0_32_;
          puVar1 = (unsigned_short *)((long)pvVar9 + lVar147 * 2 + lVar142 * uVar148);
          local_2e8 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          local_1d8 = float16_to_float32(*puVar1);
          local_1e8 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          uStack_1d4 = extraout_XMM0_Db;
          uStack_1d0 = extraout_XMM0_Dc;
          uStack_1cc = extraout_XMM0_Dd;
          local_1f8 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142));
          local_208 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          fVar217 = float16_to_float32(puVar1[lVar142]);
          auVar186 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar217;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar186._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          fVar217 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 3));
          auVar186 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar217;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar186._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          local_218._0_4_ = float16_to_float32(puVar1[lVar142 * 2]);
          local_218._4_4_ = extraout_XMM0_Db_02;
          local_218._8_4_ = extraout_XMM0_Dc_02;
          local_218._12_4_ = extraout_XMM0_Dd_02;
          local_228 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          local_238._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 5));
          local_238._4_4_ = extraout_XMM0_Db_03;
          local_238._8_4_ = extraout_XMM0_Dc_03;
          local_238._12_4_ = extraout_XMM0_Dd_03;
          local_248 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          fVar217 = float16_to_float32(puVar1[lVar142 * 3]);
          local_258 = CONCAT44(extraout_XMM0_Db_04,fVar217);
          local_268 = ZEXT416(*(uint *)(*pauVar146 + lVar147 * 4));
          auVar301._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 7));
          auVar301._4_60_ = extraout_var;
          auVar163 = vinsertps_avx(local_218,ZEXT416((uint)local_238._0_4_),0x10);
          auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_258),0x20);
          auVar163 = vinsertps_avx(auVar163,auVar301._0_16_,0x30);
          auVar162._4_4_ = uStack_1d4;
          auVar162._0_4_ = local_1d8;
          auVar162._8_4_ = uStack_1d0;
          auVar162._12_4_ = uStack_1cc;
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_1f8),0x10);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_b8._0_4_),0x20);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_f8._0_4_),0x30);
          auVar186._16_16_ = auVar163;
          auVar186._0_16_ = auVar162;
          auVar163 = vinsertps_avx(local_118._0_16_,ZEXT416((uint)local_228._0_4_),0x10);
          auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_248._0_4_),0x20);
          auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_268._0_4_),0x30);
          auVar162 = vinsertps_avx(local_2e8,ZEXT416((uint)local_1e8._0_4_),0x10);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_208._0_4_),0x20);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_d8._0_4_),0x30);
          auVar187._16_16_ = auVar163;
          auVar187._0_16_ = auVar162;
          auVar163 = vfmadd231ps_fma(local_1c8,auVar186,auVar187);
          auVar301 = ZEXT1664(auVar163);
          auVar306 = ZEXT3264(local_138);
          auVar311 = ZEXT3264(local_158);
          auVar316 = ZEXT3264(local_178);
          auVar321 = ZEXT3264(local_288);
          auVar326 = ZEXT3264(local_198);
          auVar331 = ZEXT3264(local_98);
        }
        auVar186 = vhaddps_avx(auVar306._0_32_,auVar311._0_32_);
        auVar187 = vhaddps_avx(auVar316._0_32_,auVar326._0_32_);
        auVar187 = vhaddps_avx(auVar186,auVar187);
        auVar186 = vhaddps_avx(auVar321._0_32_,auVar331._0_32_);
        auVar188 = vhaddps_avx(local_328,local_308);
        auVar188 = vhaddps_avx(auVar186,auVar188);
        auVar186 = vblendps_avx(auVar187,auVar188,0xf0);
        auVar187 = vperm2f128_avx(auVar187,auVar188,0x21);
        auVar188._0_4_ = auVar301._0_4_ + auVar187._0_4_ + auVar186._0_4_;
        auVar188._4_4_ = auVar301._4_4_ + auVar187._4_4_ + auVar186._4_4_;
        auVar188._8_4_ = auVar301._8_4_ + auVar187._8_4_ + auVar186._8_4_;
        auVar188._12_4_ = auVar301._12_4_ + auVar187._12_4_ + auVar186._12_4_;
        auVar188._16_4_ = auVar301._16_4_ + auVar187._16_4_ + auVar186._16_4_;
        auVar188._20_4_ = auVar301._20_4_ + auVar187._20_4_ + auVar186._20_4_;
        auVar188._24_4_ = auVar301._24_4_ + auVar187._24_4_ + auVar186._24_4_;
        auVar188._28_4_ = auVar301._28_4_ + auVar187._28_4_ + auVar186._28_4_;
        if (iVar140 - 1U < 6) {
          auVar190 = vmaxps_avx(auVar188,ZEXT832(0) << 0x20);
          switch(iVar140) {
          case 2:
            auVar186 = vminps_avx(auVar188,ZEXT832(0) << 0x20);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar98._4_4_ = uVar2;
            auVar98._0_4_ = uVar2;
            auVar98._8_4_ = uVar2;
            auVar98._12_4_ = uVar2;
            auVar98._16_4_ = uVar2;
            auVar98._20_4_ = uVar2;
            auVar98._24_4_ = uVar2;
            auVar98._28_4_ = uVar2;
            auVar190 = vfmadd231ps_avx512vl(auVar190,auVar186,auVar98);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar96._4_4_ = uVar2;
            auVar96._0_4_ = uVar2;
            auVar96._8_4_ = uVar2;
            auVar96._12_4_ = uVar2;
            auVar96._16_4_ = uVar2;
            auVar96._20_4_ = uVar2;
            auVar96._24_4_ = uVar2;
            auVar96._28_4_ = uVar2;
            auVar186 = vmaxps_avx512vl(auVar188,auVar96);
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar97._4_4_ = uVar2;
            auVar97._0_4_ = uVar2;
            auVar97._8_4_ = uVar2;
            auVar97._12_4_ = uVar2;
            auVar97._16_4_ = uVar2;
            auVar97._20_4_ = uVar2;
            auVar97._24_4_ = uVar2;
            auVar97._28_4_ = uVar2;
            auVar190 = vminps_avx512vl(auVar186,auVar97);
            break;
          case 4:
            auVar85._8_4_ = 0x80000000;
            auVar85._0_8_ = 0x8000000080000000;
            auVar85._12_4_ = 0x80000000;
            auVar85._16_4_ = 0x80000000;
            auVar85._20_4_ = 0x80000000;
            auVar85._24_4_ = 0x80000000;
            auVar85._28_4_ = 0x80000000;
            auVar186 = vxorps_avx512vl(auVar188,auVar85);
            auVar86._8_4_ = 0x42b0c0a5;
            auVar86._0_8_ = 0x42b0c0a542b0c0a5;
            auVar86._12_4_ = 0x42b0c0a5;
            auVar86._16_4_ = 0x42b0c0a5;
            auVar86._20_4_ = 0x42b0c0a5;
            auVar86._24_4_ = 0x42b0c0a5;
            auVar86._28_4_ = 0x42b0c0a5;
            auVar186 = vminps_avx512vl(auVar186,auVar86);
            auVar87._8_4_ = 0xc2b0c0a5;
            auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar87._12_4_ = 0xc2b0c0a5;
            auVar87._16_4_ = 0xc2b0c0a5;
            auVar87._20_4_ = 0xc2b0c0a5;
            auVar87._24_4_ = 0xc2b0c0a5;
            auVar87._28_4_ = 0xc2b0c0a5;
            auVar187 = vmaxps_avx512vl(auVar186,auVar87);
            auVar275._8_4_ = 0x3f000000;
            auVar275._0_8_ = 0x3f0000003f000000;
            auVar275._12_4_ = 0x3f000000;
            auVar275._16_4_ = 0x3f000000;
            auVar275._20_4_ = 0x3f000000;
            auVar275._24_4_ = 0x3f000000;
            auVar275._28_4_ = 0x3f000000;
            auVar88._8_4_ = 0x3fb8aa3b;
            auVar88._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar88._12_4_ = 0x3fb8aa3b;
            auVar88._16_4_ = 0x3fb8aa3b;
            auVar88._20_4_ = 0x3fb8aa3b;
            auVar88._24_4_ = 0x3fb8aa3b;
            auVar88._28_4_ = 0x3fb8aa3b;
            auVar188 = vfmadd231ps_avx512vl(auVar275,auVar187,auVar88);
            auVar186 = vroundps_avx(auVar188,1);
            uVar13 = vcmpps_avx512vl(auVar188,auVar186,1);
            auVar282._8_4_ = 0x3f800000;
            auVar282._0_8_ = 0x3f8000003f800000;
            auVar282._12_4_ = 0x3f800000;
            auVar282._16_4_ = 0x3f800000;
            auVar282._20_4_ = 0x3f800000;
            auVar282._24_4_ = 0x3f800000;
            auVar282._28_4_ = 0x3f800000;
            auVar189 = vsubps_avx512vl(auVar186,auVar282);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar209._0_4_ = (float)((uint)bVar11 * auVar189._0_4_ | (uint)!bVar11 * auVar186._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar209._4_4_ = (float)((uint)bVar11 * auVar189._4_4_ | (uint)!bVar11 * auVar186._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar209._8_4_ = (float)((uint)bVar11 * auVar189._8_4_ | (uint)!bVar11 * auVar186._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar209._12_4_ =
                 (float)((uint)bVar11 * auVar189._12_4_ | (uint)!bVar11 * auVar186._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar209._16_4_ =
                 (float)((uint)bVar11 * auVar189._16_4_ | (uint)!bVar11 * auVar186._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar209._20_4_ =
                 (float)((uint)bVar11 * auVar189._20_4_ | (uint)!bVar11 * auVar186._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar209._24_4_ =
                 (float)((uint)bVar11 * auVar189._24_4_ | (uint)!bVar11 * auVar186._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar209._28_4_ =
                 (float)((uint)bVar11 * auVar189._28_4_ | (uint)!bVar11 * auVar186._28_4_);
            auVar89._8_4_ = 0x3f318000;
            auVar89._0_8_ = 0x3f3180003f318000;
            auVar89._12_4_ = 0x3f318000;
            auVar89._16_4_ = 0x3f318000;
            auVar89._20_4_ = 0x3f318000;
            auVar89._24_4_ = 0x3f318000;
            auVar89._28_4_ = 0x3f318000;
            auVar186 = vfmsub231ps_avx512vl(auVar187,auVar209,auVar89);
            auVar90._8_4_ = 0x395e8083;
            auVar90._0_8_ = 0x395e8083395e8083;
            auVar90._12_4_ = 0x395e8083;
            auVar90._16_4_ = 0x395e8083;
            auVar90._20_4_ = 0x395e8083;
            auVar90._24_4_ = 0x395e8083;
            auVar90._28_4_ = 0x395e8083;
            auVar186 = vfmsub231ps_avx512vl(auVar186,auVar209,auVar90);
            auVar125._4_4_ = auVar186._4_4_ * auVar186._4_4_;
            auVar125._0_4_ = auVar186._0_4_ * auVar186._0_4_;
            auVar125._8_4_ = auVar186._8_4_ * auVar186._8_4_;
            auVar125._12_4_ = auVar186._12_4_ * auVar186._12_4_;
            auVar125._16_4_ = auVar186._16_4_ * auVar186._16_4_;
            auVar125._20_4_ = auVar186._20_4_ * auVar186._20_4_;
            auVar125._24_4_ = auVar186._24_4_ * auVar186._24_4_;
            auVar125._28_4_ = auVar188._28_4_;
            auVar268._8_4_ = 0x39506967;
            auVar268._0_8_ = 0x3950696739506967;
            auVar268._12_4_ = 0x39506967;
            auVar268._16_4_ = 0x39506967;
            auVar268._20_4_ = 0x39506967;
            auVar268._24_4_ = 0x39506967;
            auVar268._28_4_ = 0x39506967;
            auVar91._8_4_ = 0x3ab743ce;
            auVar91._0_8_ = 0x3ab743ce3ab743ce;
            auVar91._12_4_ = 0x3ab743ce;
            auVar91._16_4_ = 0x3ab743ce;
            auVar91._20_4_ = 0x3ab743ce;
            auVar91._24_4_ = 0x3ab743ce;
            auVar91._28_4_ = 0x3ab743ce;
            auVar187 = vfmadd213ps_avx512vl(auVar268,auVar186,auVar91);
            auVar92._8_4_ = 0x3c088908;
            auVar92._0_8_ = 0x3c0889083c088908;
            auVar92._12_4_ = 0x3c088908;
            auVar92._16_4_ = 0x3c088908;
            auVar92._20_4_ = 0x3c088908;
            auVar92._24_4_ = 0x3c088908;
            auVar92._28_4_ = 0x3c088908;
            auVar187 = vfmadd213ps_avx512vl(auVar187,auVar186,auVar92);
            auVar93._8_4_ = 0x3d2aa9c1;
            auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar93._12_4_ = 0x3d2aa9c1;
            auVar93._16_4_ = 0x3d2aa9c1;
            auVar93._20_4_ = 0x3d2aa9c1;
            auVar93._24_4_ = 0x3d2aa9c1;
            auVar93._28_4_ = 0x3d2aa9c1;
            auVar187 = vfmadd213ps_avx512vl(auVar187,auVar186,auVar93);
            auVar94._8_4_ = 0x3e2aaaaa;
            auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar94._12_4_ = 0x3e2aaaaa;
            auVar94._16_4_ = 0x3e2aaaaa;
            auVar94._20_4_ = 0x3e2aaaaa;
            auVar94._24_4_ = 0x3e2aaaaa;
            auVar94._28_4_ = 0x3e2aaaaa;
            auVar187 = vfmadd213ps_avx512vl(auVar187,auVar186,auVar94);
            auVar163 = vfmadd213ps_fma(auVar187,auVar186,auVar275);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar125,auVar186);
            auVar224._0_4_ = auVar163._0_4_ + 1.0;
            auVar224._4_4_ = auVar163._4_4_ + 1.0;
            auVar224._8_4_ = auVar163._8_4_ + 1.0;
            auVar224._12_4_ = auVar163._12_4_ + 1.0;
            auVar224._16_4_ = 0x3f800000;
            auVar224._20_4_ = 0x3f800000;
            auVar224._24_4_ = 0x3f800000;
            auVar224._28_4_ = 0x3f800000;
            auVar235._0_4_ = (int)auVar209._0_4_;
            auVar235._4_4_ = (int)auVar209._4_4_;
            auVar235._8_4_ = (int)auVar209._8_4_;
            auVar235._12_4_ = (int)auVar209._12_4_;
            auVar235._16_4_ = (int)auVar209._16_4_;
            auVar235._20_4_ = (int)auVar209._20_4_;
            auVar235._24_4_ = (int)auVar209._24_4_;
            auVar235._28_4_ = (int)auVar209._28_4_;
            auVar186 = vpslld_avx2(auVar235,0x17);
            auVar95._8_4_ = 0x3f800000;
            auVar95._0_8_ = 0x3f8000003f800000;
            auVar95._12_4_ = 0x3f800000;
            auVar95._16_4_ = 0x3f800000;
            auVar95._20_4_ = 0x3f800000;
            auVar95._24_4_ = 0x3f800000;
            auVar95._28_4_ = 0x3f800000;
            auVar186 = vpaddd_avx512vl(auVar186,auVar95);
            auVar163 = vfmadd213ps_fma(auVar186,auVar224,auVar282);
            auVar186 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar186,auVar282);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar186,auVar186);
            auVar190 = ZEXT1632(auVar163);
            break;
          case 5:
            auVar286._8_4_ = 0x42b0c0a5;
            auVar286._0_8_ = 0x42b0c0a542b0c0a5;
            auVar286._12_4_ = 0x42b0c0a5;
            auVar286._16_4_ = 0x42b0c0a5;
            auVar286._20_4_ = 0x42b0c0a5;
            auVar286._24_4_ = 0x42b0c0a5;
            auVar286._28_4_ = 0x42b0c0a5;
            auVar186 = vminps_avx(auVar188,auVar286);
            auVar290._8_4_ = 0xc2b0c0a5;
            auVar290._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar290._12_4_ = 0xc2b0c0a5;
            auVar290._16_4_ = 0xc2b0c0a5;
            auVar290._20_4_ = 0xc2b0c0a5;
            auVar290._24_4_ = 0xc2b0c0a5;
            auVar290._28_4_ = 0xc2b0c0a5;
            auVar186 = vmaxps_avx(auVar186,auVar290);
            auVar300._8_4_ = 0x3fb8aa3b;
            auVar300._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar300._12_4_ = 0x3fb8aa3b;
            auVar300._16_4_ = 0x3fb8aa3b;
            auVar300._20_4_ = 0x3fb8aa3b;
            auVar300._24_4_ = 0x3fb8aa3b;
            auVar300._28_4_ = 0x3fb8aa3b;
            auVar296._8_4_ = 0x3f000000;
            auVar296._0_8_ = 0x3f0000003f000000;
            auVar296._12_4_ = 0x3f000000;
            auVar296._16_4_ = 0x3f000000;
            auVar296._20_4_ = 0x3f000000;
            auVar296._24_4_ = 0x3f000000;
            auVar296._28_4_ = 0x3f000000;
            auVar163 = vfmadd213ps_fma(auVar300,auVar186,auVar296);
            auVar187 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar187,1);
            auVar305._8_4_ = 0x3f800000;
            auVar305._0_8_ = 0x3f8000003f800000;
            auVar305._12_4_ = 0x3f800000;
            auVar305._16_4_ = 0x3f800000;
            auVar305._20_4_ = 0x3f800000;
            auVar305._24_4_ = 0x3f800000;
            auVar305._28_4_ = 0x3f800000;
            auVar189 = vsubps_avx512vl(auVar187,auVar305);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar204._0_4_ = (float)((uint)bVar11 * auVar189._0_4_ | (uint)!bVar11 * auVar187._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar204._4_4_ = (float)((uint)bVar11 * auVar189._4_4_ | (uint)!bVar11 * auVar187._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar204._8_4_ = (float)((uint)bVar11 * auVar189._8_4_ | (uint)!bVar11 * auVar187._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar204._12_4_ =
                 (float)((uint)bVar11 * auVar189._12_4_ | (uint)!bVar11 * auVar187._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar204._16_4_ =
                 (float)((uint)bVar11 * auVar189._16_4_ | (uint)!bVar11 * auVar187._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar204._20_4_ =
                 (float)((uint)bVar11 * auVar189._20_4_ | (uint)!bVar11 * auVar187._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar204._24_4_ =
                 (float)((uint)bVar11 * auVar189._24_4_ | (uint)!bVar11 * auVar187._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar204._28_4_ =
                 (float)((uint)bVar11 * auVar189._28_4_ | (uint)!bVar11 * auVar187._28_4_);
            auVar310._8_4_ = 0x3f318000;
            auVar310._0_8_ = 0x3f3180003f318000;
            auVar310._12_4_ = 0x3f318000;
            auVar310._16_4_ = 0x3f318000;
            auVar310._20_4_ = 0x3f318000;
            auVar310._24_4_ = 0x3f318000;
            auVar310._28_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_fma(auVar186,auVar204,auVar310);
            auVar189 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar186 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar204,auVar189);
            auVar250._0_4_ = auVar186._0_4_ * auVar186._0_4_;
            auVar250._4_4_ = auVar186._4_4_ * auVar186._4_4_;
            auVar250._8_4_ = auVar186._8_4_ * auVar186._8_4_;
            auVar250._12_4_ = auVar186._12_4_ * auVar186._12_4_;
            auVar250._16_4_ = auVar186._16_4_ * auVar186._16_4_;
            auVar250._20_4_ = auVar186._20_4_ * auVar186._20_4_;
            auVar250._24_4_ = auVar186._24_4_ * auVar186._24_4_;
            auVar250._28_4_ = 0;
            auVar315._8_4_ = 0x39506967;
            auVar315._0_8_ = 0x3950696739506967;
            auVar315._12_4_ = 0x39506967;
            auVar315._16_4_ = 0x39506967;
            auVar315._20_4_ = 0x39506967;
            auVar315._24_4_ = 0x39506967;
            auVar315._28_4_ = 0x39506967;
            auVar320._8_4_ = 0x3ab743ce;
            auVar320._0_8_ = 0x3ab743ce3ab743ce;
            auVar320._12_4_ = 0x3ab743ce;
            auVar320._16_4_ = 0x3ab743ce;
            auVar320._20_4_ = 0x3ab743ce;
            auVar320._24_4_ = 0x3ab743ce;
            auVar320._28_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_fma(auVar315,auVar186,auVar320);
            auVar325._8_4_ = 0x3c088908;
            auVar325._0_8_ = 0x3c0889083c088908;
            auVar325._12_4_ = 0x3c088908;
            auVar325._16_4_ = 0x3c088908;
            auVar325._20_4_ = 0x3c088908;
            auVar325._24_4_ = 0x3c088908;
            auVar325._28_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar186,auVar325);
            auVar330._8_4_ = 0x3d2aa9c1;
            auVar330._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar330._12_4_ = 0x3d2aa9c1;
            auVar330._16_4_ = 0x3d2aa9c1;
            auVar330._20_4_ = 0x3d2aa9c1;
            auVar330._24_4_ = 0x3d2aa9c1;
            auVar330._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar186,auVar330);
            auVar190 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar187 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar186,auVar190);
            auVar163 = vfmadd213ps_fma(auVar187,auVar186,auVar296);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar250,auVar186);
            auVar233._0_4_ = auVar163._0_4_ + 1.0;
            auVar233._4_4_ = auVar163._4_4_ + 1.0;
            auVar233._8_4_ = auVar163._8_4_ + 1.0;
            auVar233._12_4_ = auVar163._12_4_ + 1.0;
            auVar233._16_4_ = 0x3f800000;
            auVar233._20_4_ = 0x3f800000;
            auVar233._24_4_ = 0x3f800000;
            auVar233._28_4_ = 0x3f800000;
            auVar251._0_4_ = (int)auVar204._0_4_;
            auVar251._4_4_ = (int)auVar204._4_4_;
            auVar251._8_4_ = (int)auVar204._8_4_;
            auVar251._12_4_ = (int)auVar204._12_4_;
            auVar251._16_4_ = (int)auVar204._16_4_;
            auVar251._20_4_ = (int)auVar204._20_4_;
            auVar251._24_4_ = (int)auVar204._24_4_;
            auVar251._28_4_ = (int)auVar204._28_4_;
            auVar186 = vpslld_avx2(auVar251,0x17);
            auVar191 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar186 = vpaddd_avx512vl(auVar186,auVar191);
            auVar163 = vfmadd213ps_fma(auVar186,auVar233,auVar305);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar194._8_4_ = 0x800000;
            auVar194._0_8_ = 0x80000000800000;
            auVar194._12_4_ = 0x800000;
            auVar194._16_4_ = 0x800000;
            auVar194._20_4_ = 0x800000;
            auVar194._24_4_ = 0x800000;
            auVar194._28_4_ = 0x800000;
            auVar186 = vmaxps_avx512vl(ZEXT1632(auVar163),auVar194);
            auVar194 = vpsrld_avx2(auVar186,0x17);
            auVar267._8_4_ = 0x807fffff;
            auVar267._0_8_ = 0x807fffff807fffff;
            auVar267._12_4_ = 0x807fffff;
            auVar267._16_4_ = 0x807fffff;
            auVar267._20_4_ = 0x807fffff;
            auVar267._24_4_ = 0x807fffff;
            auVar267._28_4_ = 0x807fffff;
            auVar74._8_4_ = 0x3f000000;
            auVar74._0_8_ = 0x3f0000003f000000;
            auVar74._12_4_ = 0x3f000000;
            auVar74._16_4_ = 0x3f000000;
            auVar74._20_4_ = 0x3f000000;
            auVar74._24_4_ = 0x3f000000;
            auVar74._28_4_ = 0x3f000000;
            auVar186 = vpternlogd_avx512vl(auVar186,auVar267,auVar74,0xea);
            auVar75._8_4_ = 0x3f3504f3;
            auVar75._0_8_ = 0x3f3504f33f3504f3;
            auVar75._12_4_ = 0x3f3504f3;
            auVar75._16_4_ = 0x3f3504f3;
            auVar75._20_4_ = 0x3f3504f3;
            auVar75._24_4_ = 0x3f3504f3;
            auVar75._28_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar186,auVar75,1);
            auVar192 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar187 = vaddps_avx512vl(auVar186,auVar192);
            auVar193 = vaddps_avx512vl(auVar187,auVar186);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar205._0_4_ = (float)((uint)bVar11 * auVar193._0_4_ | (uint)!bVar11 * auVar187._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar205._4_4_ = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar187._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar205._8_4_ = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar187._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar205._12_4_ =
                 (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar187._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar205._16_4_ =
                 (float)((uint)bVar11 * auVar193._16_4_ | (uint)!bVar11 * auVar187._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar205._20_4_ =
                 (float)((uint)bVar11 * auVar193._20_4_ | (uint)!bVar11 * auVar187._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar205._24_4_ =
                 (float)((uint)bVar11 * auVar193._24_4_ | (uint)!bVar11 * auVar187._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar205._28_4_ = (uint)bVar11 * auVar193._28_4_ | (uint)!bVar11 * auVar187._28_4_;
            auVar123._4_4_ = auVar205._4_4_ * auVar205._4_4_;
            auVar123._0_4_ = auVar205._0_4_ * auVar205._0_4_;
            auVar123._8_4_ = auVar205._8_4_ * auVar205._8_4_;
            auVar123._12_4_ = auVar205._12_4_ * auVar205._12_4_;
            auVar123._16_4_ = auVar205._16_4_ * auVar205._16_4_;
            auVar123._20_4_ = auVar205._20_4_ * auVar205._20_4_;
            auVar123._24_4_ = auVar205._24_4_ * auVar205._24_4_;
            auVar123._28_4_ = auVar186._28_4_;
            auVar274._8_4_ = 0x3d9021bb;
            auVar274._0_8_ = 0x3d9021bb3d9021bb;
            auVar274._12_4_ = 0x3d9021bb;
            auVar274._16_4_ = 0x3d9021bb;
            auVar274._20_4_ = 0x3d9021bb;
            auVar274._24_4_ = 0x3d9021bb;
            auVar274._28_4_ = 0x3d9021bb;
            auVar76._8_4_ = 0xbdebd1b8;
            auVar76._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar76._12_4_ = 0xbdebd1b8;
            auVar76._16_4_ = 0xbdebd1b8;
            auVar76._20_4_ = 0xbdebd1b8;
            auVar76._24_4_ = 0xbdebd1b8;
            auVar76._28_4_ = 0xbdebd1b8;
            auVar186 = vfmadd213ps_avx512vl(auVar274,auVar205,auVar76);
            auVar77._8_4_ = 0x3def251a;
            auVar77._0_8_ = 0x3def251a3def251a;
            auVar77._12_4_ = 0x3def251a;
            auVar77._16_4_ = 0x3def251a;
            auVar77._20_4_ = 0x3def251a;
            auVar77._24_4_ = 0x3def251a;
            auVar77._28_4_ = 0x3def251a;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar77);
            auVar78._8_4_ = 0xbdfe5d4f;
            auVar78._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar78._12_4_ = 0xbdfe5d4f;
            auVar78._16_4_ = 0xbdfe5d4f;
            auVar78._20_4_ = 0xbdfe5d4f;
            auVar78._24_4_ = 0xbdfe5d4f;
            auVar78._28_4_ = 0xbdfe5d4f;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar78);
            auVar79._8_4_ = 0x3e11e9bf;
            auVar79._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar79._12_4_ = 0x3e11e9bf;
            auVar79._16_4_ = 0x3e11e9bf;
            auVar79._20_4_ = 0x3e11e9bf;
            auVar79._24_4_ = 0x3e11e9bf;
            auVar79._28_4_ = 0x3e11e9bf;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar79);
            auVar80._8_4_ = 0xbe2aae50;
            auVar80._0_8_ = 0xbe2aae50be2aae50;
            auVar80._12_4_ = 0xbe2aae50;
            auVar80._16_4_ = 0xbe2aae50;
            auVar80._20_4_ = 0xbe2aae50;
            auVar80._24_4_ = 0xbe2aae50;
            auVar80._28_4_ = 0xbe2aae50;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar80);
            auVar81._8_4_ = 0x3e4cceac;
            auVar81._0_8_ = 0x3e4cceac3e4cceac;
            auVar81._12_4_ = 0x3e4cceac;
            auVar81._16_4_ = 0x3e4cceac;
            auVar81._20_4_ = 0x3e4cceac;
            auVar81._24_4_ = 0x3e4cceac;
            auVar81._28_4_ = 0x3e4cceac;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar81);
            auVar82._8_4_ = 0xbe7ffffc;
            auVar82._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar82._12_4_ = 0xbe7ffffc;
            auVar82._16_4_ = 0xbe7ffffc;
            auVar82._20_4_ = 0xbe7ffffc;
            auVar82._24_4_ = 0xbe7ffffc;
            auVar82._28_4_ = 0xbe7ffffc;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar82);
            auVar83._8_4_ = 0x3eaaaaaa;
            auVar83._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar83._12_4_ = 0x3eaaaaaa;
            auVar83._16_4_ = 0x3eaaaaaa;
            auVar83._20_4_ = 0x3eaaaaaa;
            auVar83._24_4_ = 0x3eaaaaaa;
            auVar83._28_4_ = 0x3eaaaaaa;
            auVar186 = vfmadd213ps_avx512vl(auVar186,auVar205,auVar83);
            auVar124._4_4_ = auVar205._4_4_ * auVar205._4_4_ * auVar205._4_4_ * auVar186._4_4_;
            auVar124._0_4_ = auVar205._0_4_ * auVar205._0_4_ * auVar205._0_4_ * auVar186._0_4_;
            auVar124._8_4_ = auVar205._8_4_ * auVar205._8_4_ * auVar205._8_4_ * auVar186._8_4_;
            auVar124._12_4_ = auVar205._12_4_ * auVar205._12_4_ * auVar205._12_4_ * auVar186._12_4_;
            auVar124._16_4_ = auVar205._16_4_ * auVar205._16_4_ * auVar205._16_4_ * auVar186._16_4_;
            auVar124._20_4_ = auVar205._20_4_ * auVar205._20_4_ * auVar205._20_4_ * auVar186._20_4_;
            auVar124._24_4_ = auVar205._24_4_ * auVar205._24_4_ * auVar205._24_4_ * auVar186._24_4_;
            auVar124._28_4_ = auVar186._28_4_;
            auVar84._8_4_ = 0xffffff82;
            auVar84._0_8_ = 0xffffff82ffffff82;
            auVar84._12_4_ = 0xffffff82;
            auVar84._16_4_ = 0xffffff82;
            auVar84._20_4_ = 0xffffff82;
            auVar84._24_4_ = 0xffffff82;
            auVar84._28_4_ = 0xffffff82;
            auVar186 = vpaddd_avx512vl(auVar194,auVar84);
            auVar186 = vcvtdq2ps_avx(auVar186);
            auVar187 = vsubps_avx512vl(auVar186,auVar305);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar206._0_4_ = (uint)bVar11 * auVar187._0_4_ | (uint)!bVar11 * auVar186._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar206._4_4_ = (uint)bVar11 * auVar187._4_4_ | (uint)!bVar11 * auVar186._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar206._8_4_ = (uint)bVar11 * auVar187._8_4_ | (uint)!bVar11 * auVar186._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar206._12_4_ = (uint)bVar11 * auVar187._12_4_ | (uint)!bVar11 * auVar186._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar206._16_4_ = (uint)bVar11 * auVar187._16_4_ | (uint)!bVar11 * auVar186._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar206._20_4_ = (uint)bVar11 * auVar187._20_4_ | (uint)!bVar11 * auVar186._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar206._24_4_ = (uint)bVar11 * auVar187._24_4_ | (uint)!bVar11 * auVar186._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar206._28_4_ = (uint)bVar11 * auVar187._28_4_ | (uint)!bVar11 * auVar186._28_4_;
            auVar186 = vfmadd231ps_avx512vl(auVar124,auVar206,auVar189);
            auVar163 = vfmsub231ps_fma(auVar186,auVar296,auVar123);
            auVar186 = vsubps_avx(ZEXT1632(auVar163),auVar205);
            auVar163 = vfmsub231ps_fma(auVar186,auVar310,auVar206);
            auVar281._8_4_ = 0xc0000000;
            auVar281._0_8_ = 0xc0000000c0000000;
            auVar281._12_4_ = 0xc0000000;
            auVar281._16_4_ = 0xc0000000;
            auVar281._20_4_ = 0xc0000000;
            auVar281._24_4_ = 0xc0000000;
            auVar281._28_4_ = 0xc0000000;
            auVar186 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar207._0_4_ =
                 (uint)bVar11 * auVar186._0_4_ | (uint)!bVar11 * (int)(auVar163._0_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar207._4_4_ =
                 (uint)bVar11 * auVar186._4_4_ | (uint)!bVar11 * (int)(auVar163._4_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar207._8_4_ =
                 (uint)bVar11 * auVar186._8_4_ | (uint)!bVar11 * (int)(auVar163._8_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar207._12_4_ =
                 (uint)bVar11 * auVar186._12_4_ | (uint)!bVar11 * (int)(auVar163._12_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar207._16_4_ = (uint)bVar11 * auVar186._16_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar207._20_4_ = (uint)bVar11 * auVar186._20_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar207._24_4_ = (uint)bVar11 * auVar186._24_4_ | (uint)!bVar11 * -0x80000000;
            auVar207._28_4_ = (uint)(byte)(uVar13 >> 7) * auVar186._28_4_;
            auVar186 = vminps_avx(auVar207,auVar286);
            auVar186 = vmaxps_avx(auVar186,auVar290);
            auVar163 = vfmadd213ps_fma(auVar300,auVar186,auVar296);
            auVar187 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar187,1);
            auVar193 = vsubps_avx512vl(auVar187,auVar305);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar208._0_4_ = (float)((uint)bVar11 * auVar193._0_4_ | (uint)!bVar11 * auVar187._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar208._4_4_ = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar187._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar208._8_4_ = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar187._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar208._12_4_ =
                 (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar187._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar208._16_4_ =
                 (float)((uint)bVar11 * auVar193._16_4_ | (uint)!bVar11 * auVar187._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar208._20_4_ =
                 (float)((uint)bVar11 * auVar193._20_4_ | (uint)!bVar11 * auVar187._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar208._24_4_ =
                 (float)((uint)bVar11 * auVar193._24_4_ | (uint)!bVar11 * auVar187._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar208._28_4_ =
                 (float)((uint)bVar11 * auVar193._28_4_ | (uint)!bVar11 * auVar187._28_4_);
            auVar163 = vfmsub231ps_fma(auVar186,auVar208,auVar310);
            auVar186 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar208,auVar189);
            auVar252._0_4_ = auVar186._0_4_ * auVar186._0_4_;
            auVar252._4_4_ = auVar186._4_4_ * auVar186._4_4_;
            auVar252._8_4_ = auVar186._8_4_ * auVar186._8_4_;
            auVar252._12_4_ = auVar186._12_4_ * auVar186._12_4_;
            auVar252._16_4_ = auVar186._16_4_ * auVar186._16_4_;
            auVar252._20_4_ = auVar186._20_4_ * auVar186._20_4_;
            auVar252._24_4_ = auVar186._24_4_ * auVar186._24_4_;
            auVar252._28_4_ = 0;
            auVar163 = vfmadd213ps_fma(auVar315,auVar186,auVar320);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar186,auVar325);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar186,auVar330);
            auVar187 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar186,auVar190);
            auVar163 = vfmadd213ps_fma(auVar187,auVar186,auVar296);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar252,auVar186);
            auVar234._0_4_ = auVar163._0_4_ + 1.0;
            auVar234._4_4_ = auVar163._4_4_ + 1.0;
            auVar234._8_4_ = auVar163._8_4_ + 1.0;
            auVar234._12_4_ = auVar163._12_4_ + 1.0;
            auVar234._16_4_ = 0x3f800000;
            auVar234._20_4_ = 0x3f800000;
            auVar234._24_4_ = 0x3f800000;
            auVar234._28_4_ = 0x3f800000;
            auVar253._0_4_ = (int)auVar208._0_4_;
            auVar253._4_4_ = (int)auVar208._4_4_;
            auVar253._8_4_ = (int)auVar208._8_4_;
            auVar253._12_4_ = (int)auVar208._12_4_;
            auVar253._16_4_ = (int)auVar208._16_4_;
            auVar253._20_4_ = (int)auVar208._20_4_;
            auVar253._24_4_ = (int)auVar208._24_4_;
            auVar253._28_4_ = (int)auVar208._28_4_;
            auVar186 = vpslld_avx2(auVar253,0x17);
            auVar186 = vpaddd_avx512vl(auVar186,auVar191);
            auVar163 = vfmadd213ps_fma(auVar186,auVar234,auVar305);
            auVar186 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar186,auVar305);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar186,auVar186);
            auVar187 = vfnmadd213ps_avx512vl(ZEXT1632(auVar163),auVar281,auVar192);
            auVar190._4_4_ = auVar187._4_4_ * auVar188._4_4_;
            auVar190._0_4_ = auVar187._0_4_ * auVar188._0_4_;
            auVar190._8_4_ = auVar187._8_4_ * auVar188._8_4_;
            auVar190._12_4_ = auVar187._12_4_ * auVar188._12_4_;
            auVar190._16_4_ = auVar187._16_4_ * auVar188._16_4_;
            auVar190._20_4_ = auVar187._20_4_ * auVar188._20_4_;
            auVar190._24_4_ = auVar187._24_4_ * auVar188._24_4_;
            auVar190._28_4_ = auVar186._28_4_;
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar193._4_4_ = uVar2;
            auVar193._0_4_ = uVar2;
            auVar193._8_4_ = uVar2;
            auVar193._12_4_ = uVar2;
            auVar193._16_4_ = uVar2;
            auVar193._20_4_ = uVar2;
            auVar193._24_4_ = uVar2;
            auVar193._28_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar191._4_4_ = uVar2;
            auVar191._0_4_ = uVar2;
            auVar191._8_4_ = uVar2;
            auVar191._12_4_ = uVar2;
            auVar191._16_4_ = uVar2;
            auVar191._20_4_ = uVar2;
            auVar191._24_4_ = uVar2;
            auVar191._28_4_ = uVar2;
            auVar186 = vfmadd213ps_avx512vl(auVar193,auVar188,auVar191);
            auVar186 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
            auVar192._8_4_ = 0x3f800000;
            auVar192._0_8_ = 0x3f8000003f800000;
            auVar192._12_4_ = 0x3f800000;
            auVar192._16_4_ = 0x3f800000;
            auVar192._20_4_ = 0x3f800000;
            auVar192._24_4_ = 0x3f800000;
            auVar192._28_4_ = 0x3f800000;
            auVar186 = vminps_avx512vl(auVar186,auVar192);
            auVar190._4_4_ = auVar186._4_4_ * auVar188._4_4_;
            auVar190._0_4_ = auVar186._0_4_ * auVar188._0_4_;
            auVar190._8_4_ = auVar186._8_4_ * auVar188._8_4_;
            auVar190._12_4_ = auVar186._12_4_ * auVar188._12_4_;
            auVar190._16_4_ = auVar186._16_4_ * auVar188._16_4_;
            auVar190._20_4_ = auVar186._20_4_ * auVar188._20_4_;
            auVar190._24_4_ = auVar186._24_4_ * auVar188._24_4_;
            auVar190._28_4_ = auVar186._28_4_;
          }
          auVar188 = auVar190;
        }
        *(undefined1 (*) [32])((long)top_blob->data + local_2c8 * 4) = auVar188;
        lVar145 = local_290 + 8;
        lVar150 = local_298 + 8;
        lVar151 = local_2a0 + 8;
        lVar153 = local_2a8 + 8;
        lVar155 = local_2b0 + 8;
        lVar157 = local_2b8 + 8;
        lVar160 = local_2c0 + 8;
        uVar148 = uVar148 + 8;
      }
      uVar148 = local_2d0 & 0xfffffffffffffff8;
      uVar141 = uVar141 >> 2 & 1;
      lVar145 = uVar148 + 3;
      local_258 = uVar148 + 2;
      local_268._0_8_ = uVar148 + 1;
      local_198._0_8_ = uVar148;
      local_138._0_8_ = uVar148;
      uVar148 = 0;
      while (pauVar146 = local_378, uVar148 != uVar141) {
        uVar144 = local_198._0_8_ + uVar148 * 4;
        local_178._0_8_ = uVar148;
        if (lVar8 == 0) {
          auVar163 = ZEXT816(0) << 0x40;
        }
        else {
          auVar163 = *(undefined1 (*) [16])(lVar8 + uVar144 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar151 = (long)(this->weight_data_tm).w;
        lVar150 = sVar10 * lVar151;
        local_288._0_8_ = uVar144;
        pauVar158 = (undefined1 (*) [16])(lVar150 * uVar144 + (long)pvVar9);
        pauVar152 = (undefined1 (*) [16])((uVar144 | 1) * lVar150 + (long)pvVar9);
        pauVar154 = (undefined1 (*) [16])((uVar144 | 2) * lVar150 + (long)pvVar9);
        pauVar156 = (undefined1 (*) [16])(lVar150 * (uVar144 | 3) + (long)pvVar9);
        lVar153 = 0;
        auVar162 = ZEXT816(0) << 0x40;
        lVar150 = 0;
        auVar164 = ZEXT816(0) << 0x40;
        auVar165 = ZEXT816(0) << 0x40;
        auVar166 = ZEXT816(0) << 0x40;
        iVar161 = 0;
        pauVar159 = local_378;
        while( true ) {
          auVar311 = ZEXT1664(auVar166);
          auVar306 = ZEXT1664(auVar165);
          auVar326 = ZEXT1664(auVar164);
          auVar301 = ZEXT1664(auVar162);
          local_b8 = ZEXT1632(auVar162);
          local_d8 = ZEXT1632(auVar164);
          local_f8 = ZEXT1632(auVar165);
          local_118 = ZEXT1632(auVar166);
          if (iVar143 <= iVar161 + 7) break;
          auVar186 = *pauVar159;
          auVar162 = vlddqu_avx(*pauVar158);
          auVar187 = vcvtph2ps_f16c(auVar162);
          auVar162 = vlddqu_avx(*pauVar152);
          auVar188 = vcvtph2ps_f16c(auVar162);
          auVar162 = vlddqu_avx(*pauVar154);
          auVar189 = vcvtph2ps_f16c(auVar162);
          auVar162 = vlddqu_avx(*pauVar156);
          auVar190 = vcvtph2ps_f16c(auVar162);
          auVar162 = vfmadd231ps_fma(local_b8,auVar186,auVar187);
          auVar164 = vfmadd231ps_fma(local_d8,auVar186,auVar188);
          auVar165 = vfmadd231ps_fma(local_f8,auVar186,auVar189);
          auVar166 = vfmadd231ps_fma(local_118,auVar186,auVar190);
          pauVar159 = pauVar159 + 1;
          pauVar158 = pauVar158 + 1;
          pauVar152 = pauVar152 + 1;
          pauVar154 = pauVar154 + 1;
          pauVar156 = pauVar156 + 1;
          iVar161 = iVar161 + 8;
          lVar150 = lVar150 + 0x10;
          lVar153 = lVar153 + 8;
        }
        local_158._0_8_ = lVar145;
        lVar157 = sVar10 * lVar145 * lVar151;
        lVar145 = sVar10 * local_258 * lVar151;
        lVar155 = sVar10 * local_268._0_8_ * lVar151;
        lVar151 = sVar10 * local_138._0_8_ * lVar151;
        local_218 = ZEXT816(0) << 0x40;
        local_228 = ZEXT816(0) << 0x40;
        local_238 = ZEXT816(0) << 0x40;
        local_248 = ZEXT816(0) << 0x40;
        for (; iVar161 + 3 < iVar143; iVar161 = iVar161 + 4) {
          auVar164._8_8_ = 0;
          auVar164._0_8_ = *(ulong *)((long)pvVar9 + lVar150 + lVar151);
          auVar164 = vcvtph2ps_f16c(auVar164);
          auVar165._8_8_ = 0;
          auVar165._0_8_ = *(ulong *)((long)pvVar9 + lVar150 + lVar155);
          auVar165 = vcvtph2ps_f16c(auVar165);
          auVar166._8_8_ = 0;
          auVar166._0_8_ = *(ulong *)((long)pvVar9 + lVar150 + lVar145);
          auVar166 = vcvtph2ps_f16c(auVar166);
          auVar167._8_8_ = 0;
          auVar167._0_8_ = *(ulong *)((long)pvVar9 + lVar150 + lVar157);
          auVar167 = vcvtph2ps_f16c(auVar167);
          auVar162 = *(undefined1 (*) [16])(*local_378 + lVar150 * 2);
          local_218 = vfmadd231ps_fma(local_218,auVar162,auVar164);
          local_228 = vfmadd231ps_fma(local_228,auVar162,auVar165);
          local_238 = vfmadd231ps_fma(local_238,auVar162,auVar166);
          local_248 = vfmadd231ps_fma(local_248,auVar162,auVar167);
          lVar150 = lVar150 + 8;
          lVar153 = lVar153 + 4;
        }
        for (; (int)lVar153 < iVar143; lVar153 = lVar153 + 1) {
          local_328._0_16_ = auVar163;
          local_308._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar153 * 4));
          fVar217 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar153 * 2 + lVar151));
          auVar186 = local_1c8;
          local_1c8._4_4_ = extraout_XMM0_Db_05;
          local_1c8._0_4_ = fVar217;
          local_1c8._8_4_ = extraout_XMM0_Dc_04;
          local_1c8._16_16_ = auVar186._16_16_;
          local_1c8._12_4_ = extraout_XMM0_Dd_04;
          local_2e8 = ZEXT416(*(uint *)(*pauVar146 + lVar153 * 4));
          local_1d8 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar153 * 2 + lVar155));
          local_1e8 = ZEXT416(*(uint *)(*pauVar146 + lVar153 * 4));
          local_1f8 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar153 * 2 + lVar145));
          local_208 = ZEXT416(*(uint *)(*pauVar146 + lVar153 * 4));
          auVar326._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar153 * 2 + lVar157));
          auVar326._4_60_ = extraout_var_00;
          auVar163 = vinsertps_avx(local_1c8._0_16_,ZEXT416((uint)local_1d8),0x10);
          auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1f8),0x20);
          auVar163 = vinsertps_avx(auVar163,auVar326._0_16_,0x30);
          auVar162 = vinsertps_avx(local_308._0_16_,ZEXT416((uint)local_2e8._0_4_),0x10);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_1e8._0_4_),0x20);
          auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_208._0_4_),0x30);
          auVar163 = vfmadd231ps_fma(local_328._0_16_,auVar163,auVar162);
          auVar301 = ZEXT3264(local_b8);
          auVar326 = ZEXT3264(local_d8);
          auVar306 = ZEXT3264(local_f8);
          auVar311 = ZEXT3264(local_118);
        }
        auVar186 = vhaddps_avx(auVar301._0_32_,auVar326._0_32_);
        auVar187 = vhaddps_avx(auVar306._0_32_,auVar311._0_32_);
        auVar186 = vhaddps_avx(auVar186,auVar187);
        auVar164 = vunpcklps_avx(local_218,local_228);
        auVar165 = vunpcklps_avx(local_238,local_248);
        auVar166 = vunpckhps_avx(local_218,local_228);
        auVar167 = vunpckhps_avx(local_238,local_248);
        auVar162 = vmovlhps_avx(auVar164,auVar165);
        auVar165 = vunpckhpd_avx(auVar164,auVar165);
        auVar164 = vmovlhps_avx(auVar166,auVar167);
        auVar166 = vunpckhpd_avx(auVar166,auVar167);
        auVar168._0_4_ =
             auVar165._0_4_ + auVar162._0_4_ + auVar164._0_4_ + auVar166._0_4_ + auVar163._0_4_ +
             auVar186._0_4_ + auVar186._16_4_;
        auVar168._4_4_ =
             auVar165._4_4_ + auVar162._4_4_ + auVar164._4_4_ + auVar166._4_4_ + auVar163._4_4_ +
             auVar186._4_4_ + auVar186._20_4_;
        auVar168._8_4_ =
             auVar165._8_4_ + auVar162._8_4_ + auVar164._8_4_ + auVar166._8_4_ + auVar163._8_4_ +
             auVar186._8_4_ + auVar186._24_4_;
        auVar168._12_4_ =
             auVar165._12_4_ + auVar162._12_4_ + auVar164._12_4_ + auVar166._12_4_ + auVar163._12_4_
             + auVar186._12_4_ + auVar186._28_4_;
        auVar163 = auVar168;
        if (iVar140 - 1U < 6) {
          auVar162 = ZEXT816(0) << 0x20;
          auVar163 = vmaxps_avx(auVar168,auVar162);
          switch(iVar140) {
          case 2:
            auVar162 = vminps_avx(auVar168,auVar162);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar44._4_4_ = uVar2;
            auVar44._0_4_ = uVar2;
            auVar44._8_4_ = uVar2;
            auVar44._12_4_ = uVar2;
            auVar163 = vfmadd231ps_avx512vl(auVar163,auVar162,auVar44);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar42._4_4_ = uVar2;
            auVar42._0_4_ = uVar2;
            auVar42._8_4_ = uVar2;
            auVar42._12_4_ = uVar2;
            auVar163 = vmaxps_avx512vl(auVar168,auVar42);
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar43._4_4_ = uVar2;
            auVar43._0_4_ = uVar2;
            auVar43._8_4_ = uVar2;
            auVar43._12_4_ = uVar2;
            auVar163 = vminps_avx512vl(auVar163,auVar43);
            break;
          case 4:
            auVar31._8_4_ = 0x80000000;
            auVar31._0_8_ = 0x8000000080000000;
            auVar31._12_4_ = 0x80000000;
            auVar163 = vxorps_avx512vl(auVar168,auVar31);
            auVar32._8_4_ = 0x42b0c0a5;
            auVar32._0_8_ = 0x42b0c0a542b0c0a5;
            auVar32._12_4_ = 0x42b0c0a5;
            auVar163 = vminps_avx512vl(auVar163,auVar32);
            auVar33._8_4_ = 0xc2b0c0a5;
            auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar33._12_4_ = 0xc2b0c0a5;
            auVar162 = vmaxps_avx512vl(auVar163,auVar33);
            auVar272._8_4_ = 0x3f000000;
            auVar272._0_8_ = 0x3f0000003f000000;
            auVar272._12_4_ = 0x3f000000;
            auVar34._8_4_ = 0x3fb8aa3b;
            auVar34._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar34._12_4_ = 0x3fb8aa3b;
            auVar164 = vfmadd231ps_avx512vl(auVar272,auVar162,auVar34);
            auVar246._0_4_ = (int)auVar164._0_4_;
            auVar246._4_4_ = (int)auVar164._4_4_;
            auVar246._8_4_ = (int)auVar164._8_4_;
            auVar246._12_4_ = (int)auVar164._12_4_;
            auVar163 = vcvtdq2ps_avx(auVar246);
            uVar148 = vcmpps_avx512vl(auVar164,auVar163,1);
            auVar279._8_4_ = 0x3f800000;
            auVar279._0_8_ = 0x3f8000003f800000;
            auVar279._12_4_ = 0x3f800000;
            auVar164 = vsubps_avx512vl(auVar163,auVar279);
            bVar11 = (bool)((byte)uVar148 & 1);
            auVar185._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar163._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 1) & 1);
            auVar185._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar163._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 2) & 1);
            auVar185._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar163._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 3) & 1);
            auVar185._12_4_ =
                 (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar163._12_4_);
            auVar35._8_4_ = 0x3f318000;
            auVar35._0_8_ = 0x3f3180003f318000;
            auVar35._12_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_avx512vl(auVar162,auVar185,auVar35);
            auVar36._8_4_ = 0x395e8083;
            auVar36._0_8_ = 0x395e8083395e8083;
            auVar36._12_4_ = 0x395e8083;
            auVar162 = vfmsub231ps_avx512vl(auVar163,auVar185,auVar36);
            auVar229._0_4_ = auVar162._0_4_ * auVar162._0_4_;
            auVar229._4_4_ = auVar162._4_4_ * auVar162._4_4_;
            auVar229._8_4_ = auVar162._8_4_ * auVar162._8_4_;
            auVar229._12_4_ = auVar162._12_4_ * auVar162._12_4_;
            auVar265._8_4_ = 0x39506967;
            auVar265._0_8_ = 0x3950696739506967;
            auVar265._12_4_ = 0x39506967;
            auVar37._8_4_ = 0x3ab743ce;
            auVar37._0_8_ = 0x3ab743ce3ab743ce;
            auVar37._12_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_avx512vl(auVar265,auVar162,auVar37);
            auVar38._8_4_ = 0x3c088908;
            auVar38._0_8_ = 0x3c0889083c088908;
            auVar38._12_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar38);
            auVar39._8_4_ = 0x3d2aa9c1;
            auVar39._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar39._12_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar39);
            auVar40._8_4_ = 0x3e2aaaaa;
            auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar40._12_4_ = 0x3e2aaaaa;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar40);
            auVar163 = vfmadd213ps_fma(auVar163,auVar162,auVar272);
            auVar163 = vfmadd213ps_fma(auVar163,auVar229,auVar162);
            auVar220._0_4_ = auVar163._0_4_ + 1.0;
            auVar220._4_4_ = auVar163._4_4_ + 1.0;
            auVar220._8_4_ = auVar163._8_4_ + 1.0;
            auVar220._12_4_ = auVar163._12_4_ + 1.0;
            auVar230._0_4_ = (int)auVar185._0_4_;
            auVar230._4_4_ = (int)auVar185._4_4_;
            auVar230._8_4_ = (int)auVar185._8_4_;
            auVar230._12_4_ = (int)auVar185._12_4_;
            auVar163 = vpslld_avx(auVar230,0x17);
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar163 = vpaddd_avx512vl(auVar163,auVar41);
            auVar162 = vfmadd213ps_fma(auVar163,auVar220,auVar279);
            auVar163 = vrcpps_avx(auVar162);
            auVar162 = vfmsub213ps_fma(auVar162,auVar163,auVar279);
            auVar163 = vfnmadd132ps_fma(auVar162,auVar163,auVar163);
            break;
          case 5:
            auVar284._8_4_ = 0x42b0c0a5;
            auVar284._0_8_ = 0x42b0c0a542b0c0a5;
            auVar284._12_4_ = 0x42b0c0a5;
            auVar163 = vminps_avx(auVar168,auVar284);
            auVar288._8_4_ = 0xc2b0c0a5;
            auVar288._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar288._12_4_ = 0xc2b0c0a5;
            auVar164 = vmaxps_avx(auVar163,auVar288);
            auVar298._8_4_ = 0x3fb8aa3b;
            auVar298._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar298._12_4_ = 0x3fb8aa3b;
            auVar292._8_4_ = 0x3f000000;
            auVar292._0_8_ = 0x3f0000003f000000;
            auVar292._12_4_ = 0x3f000000;
            auVar165 = vfmadd213ps_fma(auVar298,auVar164,auVar292);
            auVar261._0_4_ = (int)auVar165._0_4_;
            auVar261._4_4_ = (int)auVar165._4_4_;
            auVar261._8_4_ = (int)auVar165._8_4_;
            auVar261._12_4_ = (int)auVar165._12_4_;
            auVar163 = vcvtdq2ps_avx(auVar261);
            uVar148 = vcmpps_avx512vl(auVar165,auVar163,1);
            auVar303._8_4_ = 0x3f800000;
            auVar303._0_8_ = 0x3f8000003f800000;
            auVar303._12_4_ = 0x3f800000;
            auVar165 = vsubps_avx512vl(auVar163,auVar303);
            bVar11 = (bool)((byte)uVar148 & 1);
            auVar180._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar163._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 1) & 1);
            auVar180._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar163._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 2) & 1);
            auVar180._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar163._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 3) & 1);
            auVar180._12_4_ =
                 (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar163._12_4_);
            auVar308._8_4_ = 0x3f318000;
            auVar308._0_8_ = 0x3f3180003f318000;
            auVar308._12_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_fma(auVar164,auVar180,auVar308);
            auVar165 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar164 = vfnmsub231ps_avx512vl(auVar163,auVar180,auVar165);
            auVar242._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar242._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar242._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar242._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar313._8_4_ = 0x39506967;
            auVar313._0_8_ = 0x3950696739506967;
            auVar313._12_4_ = 0x39506967;
            auVar318._8_4_ = 0x3ab743ce;
            auVar318._0_8_ = 0x3ab743ce3ab743ce;
            auVar318._12_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_fma(auVar313,auVar164,auVar318);
            auVar323._8_4_ = 0x3c088908;
            auVar323._0_8_ = 0x3c0889083c088908;
            auVar323._12_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar323);
            auVar328._8_4_ = 0x3d2aa9c1;
            auVar328._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar328._12_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar328);
            auVar166 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar166);
            auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar292);
            auVar163 = vfmadd213ps_fma(auVar163,auVar242,auVar164);
            auVar226._0_4_ = auVar163._0_4_ + 1.0;
            auVar226._4_4_ = auVar163._4_4_ + 1.0;
            auVar226._8_4_ = auVar163._8_4_ + 1.0;
            auVar226._12_4_ = auVar163._12_4_ + 1.0;
            auVar243._0_4_ = (int)auVar180._0_4_;
            auVar243._4_4_ = (int)auVar180._4_4_;
            auVar243._8_4_ = (int)auVar180._8_4_;
            auVar243._12_4_ = (int)auVar180._12_4_;
            auVar163 = vpslld_avx(auVar243,0x17);
            auVar167 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar163 = vpaddd_avx512vl(auVar163,auVar167);
            auVar163 = vfmadd213ps_fma(auVar163,auVar226,auVar303);
            uVar148 = vcmpps_avx512vl(auVar163,auVar162,2);
            auVar17._8_4_ = 0x800000;
            auVar17._0_8_ = 0x80000000800000;
            auVar17._12_4_ = 0x800000;
            auVar163 = vmaxps_avx512vl(auVar163,auVar17);
            auVar164 = vpsrld_avx(auVar163,0x17);
            auVar262._8_4_ = 0x807fffff;
            auVar262._0_8_ = 0x807fffff807fffff;
            auVar262._12_4_ = 0x807fffff;
            auVar18._8_4_ = 0x3f000000;
            auVar18._0_8_ = 0x3f0000003f000000;
            auVar18._12_4_ = 0x3f000000;
            auVar163 = vpternlogd_avx512vl(auVar163,auVar262,auVar18,0xea);
            auVar19._8_4_ = 0x3f3504f3;
            auVar19._0_8_ = 0x3f3504f33f3504f3;
            auVar19._12_4_ = 0x3f3504f3;
            uVar144 = vcmpps_avx512vl(auVar163,auVar19,1);
            auVar20._8_4_ = 0xbf800000;
            auVar20._0_8_ = 0xbf800000bf800000;
            auVar20._12_4_ = 0xbf800000;
            auVar162 = vaddps_avx512vl(auVar163,auVar20);
            auVar163 = vaddps_avx512vl(auVar162,auVar163);
            bVar11 = (bool)((byte)uVar144 & 1);
            auVar181._0_4_ = (float)((uint)bVar11 * auVar163._0_4_ | (uint)!bVar11 * auVar162._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar144 >> 1) & 1);
            auVar181._4_4_ = (float)((uint)bVar11 * auVar163._4_4_ | (uint)!bVar11 * auVar162._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar144 >> 2) & 1);
            auVar181._8_4_ = (float)((uint)bVar11 * auVar163._8_4_ | (uint)!bVar11 * auVar162._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar144 >> 3) & 1);
            auVar181._12_4_ =
                 (float)((uint)bVar11 * auVar163._12_4_ | (uint)!bVar11 * auVar162._12_4_);
            auVar227._0_4_ = auVar181._0_4_ * auVar181._0_4_;
            auVar227._4_4_ = auVar181._4_4_ * auVar181._4_4_;
            auVar227._8_4_ = auVar181._8_4_ * auVar181._8_4_;
            auVar227._12_4_ = auVar181._12_4_ * auVar181._12_4_;
            auVar270._8_4_ = 0x3d9021bb;
            auVar270._0_8_ = 0x3d9021bb3d9021bb;
            auVar270._12_4_ = 0x3d9021bb;
            auVar21._8_4_ = 0xbdebd1b8;
            auVar21._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar21._12_4_ = 0xbdebd1b8;
            auVar163 = vfmadd213ps_avx512vl(auVar270,auVar181,auVar21);
            auVar22._8_4_ = 0x3def251a;
            auVar22._0_8_ = 0x3def251a3def251a;
            auVar22._12_4_ = 0x3def251a;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar22);
            auVar23._8_4_ = 0xbdfe5d4f;
            auVar23._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar23._12_4_ = 0xbdfe5d4f;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar23);
            auVar24._8_4_ = 0x3e11e9bf;
            auVar24._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar24._12_4_ = 0x3e11e9bf;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar24);
            auVar25._8_4_ = 0xbe2aae50;
            auVar25._0_8_ = 0xbe2aae50be2aae50;
            auVar25._12_4_ = 0xbe2aae50;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar25);
            auVar26._8_4_ = 0x3e4cceac;
            auVar26._0_8_ = 0x3e4cceac3e4cceac;
            auVar26._12_4_ = 0x3e4cceac;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar26);
            auVar27._8_4_ = 0xbe7ffffc;
            auVar27._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar27._12_4_ = 0xbe7ffffc;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar27);
            auVar28._8_4_ = 0x3eaaaaaa;
            auVar28._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar28._12_4_ = 0x3eaaaaaa;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar181,auVar28);
            auVar271._0_4_ = auVar227._0_4_ * auVar181._0_4_ * auVar163._0_4_;
            auVar271._4_4_ = auVar227._4_4_ * auVar181._4_4_ * auVar163._4_4_;
            auVar271._8_4_ = auVar227._8_4_ * auVar181._8_4_ * auVar163._8_4_;
            auVar271._12_4_ = auVar227._12_4_ * auVar181._12_4_ * auVar163._12_4_;
            auVar29._8_4_ = 0xffffff82;
            auVar29._0_8_ = 0xffffff82ffffff82;
            auVar29._12_4_ = 0xffffff82;
            auVar163 = vpaddd_avx512vl(auVar164,auVar29);
            auVar163 = vcvtdq2ps_avx(auVar163);
            auVar162 = vsubps_avx512vl(auVar163,auVar303);
            bVar11 = (bool)((byte)uVar144 & 1);
            auVar182._0_4_ = (uint)bVar11 * auVar162._0_4_ | (uint)!bVar11 * auVar163._0_4_;
            bVar11 = (bool)((byte)(uVar144 >> 1) & 1);
            auVar182._4_4_ = (uint)bVar11 * auVar162._4_4_ | (uint)!bVar11 * auVar163._4_4_;
            bVar11 = (bool)((byte)(uVar144 >> 2) & 1);
            auVar182._8_4_ = (uint)bVar11 * auVar162._8_4_ | (uint)!bVar11 * auVar163._8_4_;
            bVar11 = (bool)((byte)(uVar144 >> 3) & 1);
            auVar182._12_4_ = (uint)bVar11 * auVar162._12_4_ | (uint)!bVar11 * auVar163._12_4_;
            auVar163 = vfmadd231ps_avx512vl(auVar271,auVar182,auVar165);
            auVar163 = vfmsub231ps_fma(auVar163,auVar292,auVar227);
            auVar163 = vsubps_avx(auVar163,auVar181);
            auVar163 = vfnmadd231ps_fma(auVar163,auVar308,auVar182);
            auVar162 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar148 & 1);
            auVar183._0_4_ =
                 (uint)bVar11 * auVar162._0_4_ |
                 (uint)!bVar11 * (int)(auVar163._0_4_ + auVar163._0_4_);
            bVar11 = (bool)((byte)(uVar148 >> 1) & 1);
            auVar183._4_4_ =
                 (uint)bVar11 * auVar162._4_4_ |
                 (uint)!bVar11 * (int)(auVar163._4_4_ + auVar163._4_4_);
            bVar11 = (bool)((byte)(uVar148 >> 2) & 1);
            auVar183._8_4_ =
                 (uint)bVar11 * auVar162._8_4_ |
                 (uint)!bVar11 * (int)(auVar163._8_4_ + auVar163._8_4_);
            bVar11 = (bool)((byte)(uVar148 >> 3) & 1);
            auVar183._12_4_ =
                 (uint)bVar11 * auVar162._12_4_ |
                 (uint)!bVar11 * (int)(auVar163._12_4_ + auVar163._12_4_);
            auVar163 = vminps_avx(auVar183,auVar284);
            auVar162 = vmaxps_avx(auVar163,auVar288);
            auVar164 = vfmadd213ps_fma(auVar298,auVar162,auVar292);
            auVar263._0_4_ = (int)auVar164._0_4_;
            auVar263._4_4_ = (int)auVar164._4_4_;
            auVar263._8_4_ = (int)auVar164._8_4_;
            auVar263._12_4_ = (int)auVar164._12_4_;
            auVar163 = vcvtdq2ps_avx(auVar263);
            uVar148 = vcmpps_avx512vl(auVar164,auVar163,1);
            auVar164 = vsubps_avx512vl(auVar163,auVar303);
            bVar11 = (bool)((byte)uVar148 & 1);
            auVar184._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar163._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 1) & 1);
            auVar184._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar163._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 2) & 1);
            auVar184._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar163._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar148 >> 3) & 1);
            auVar184._12_4_ =
                 (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar163._12_4_);
            auVar163 = vfmsub231ps_fma(auVar162,auVar184,auVar308);
            auVar162 = vfnmsub231ps_avx512vl(auVar163,auVar184,auVar165);
            auVar244._0_4_ = auVar162._0_4_ * auVar162._0_4_;
            auVar244._4_4_ = auVar162._4_4_ * auVar162._4_4_;
            auVar244._8_4_ = auVar162._8_4_ * auVar162._8_4_;
            auVar244._12_4_ = auVar162._12_4_ * auVar162._12_4_;
            auVar163 = vfmadd213ps_fma(auVar313,auVar162,auVar318);
            auVar163 = vfmadd213ps_fma(auVar163,auVar162,auVar323);
            auVar163 = vfmadd213ps_fma(auVar163,auVar162,auVar328);
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar166);
            auVar163 = vfmadd213ps_fma(auVar163,auVar162,auVar292);
            auVar163 = vfmadd213ps_fma(auVar163,auVar244,auVar162);
            auVar245._0_4_ = auVar163._0_4_ + 1.0;
            auVar245._4_4_ = auVar163._4_4_ + 1.0;
            auVar245._8_4_ = auVar163._8_4_ + 1.0;
            auVar245._12_4_ = auVar163._12_4_ + 1.0;
            auVar228._0_4_ = (int)auVar184._0_4_;
            auVar228._4_4_ = (int)auVar184._4_4_;
            auVar228._8_4_ = (int)auVar184._8_4_;
            auVar228._12_4_ = (int)auVar184._12_4_;
            auVar163 = vpslld_avx(auVar228,0x17);
            auVar163 = vpaddd_avx512vl(auVar163,auVar167);
            auVar162 = vfmadd213ps_fma(auVar163,auVar245,auVar303);
            auVar163 = vrcpps_avx(auVar162);
            auVar264._0_4_ = auVar163._0_4_ + auVar163._0_4_;
            auVar264._4_4_ = auVar163._4_4_ + auVar163._4_4_;
            auVar264._8_4_ = auVar163._8_4_ + auVar163._8_4_;
            auVar264._12_4_ = auVar163._12_4_ + auVar163._12_4_;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar162 = vfmsub213ps_avx512vl(auVar162,auVar264,auVar30);
            auVar163 = vfnmadd213ps_fma(auVar162,auVar163,auVar264);
            auVar163 = vfmsub213ps_fma(auVar163,auVar168,auVar168);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar231._4_4_ = uVar2;
            auVar231._0_4_ = uVar2;
            auVar231._8_4_ = uVar2;
            auVar231._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar219._4_4_ = uVar2;
            auVar219._0_4_ = uVar2;
            auVar219._8_4_ = uVar2;
            auVar219._12_4_ = uVar2;
            auVar163 = vfmadd213ps_avx512vl(auVar231,auVar168,auVar219);
            auVar163 = vmaxps_avx(auVar163,auVar162);
            auVar16._8_4_ = 0x3f800000;
            auVar16._0_8_ = 0x3f8000003f800000;
            auVar16._12_4_ = 0x3f800000;
            auVar162 = vminps_avx512vl(auVar163,auVar16);
            auVar163._0_4_ = auVar162._0_4_ * auVar168._0_4_;
            auVar163._4_4_ = auVar162._4_4_ * auVar168._4_4_;
            auVar163._8_4_ = auVar162._8_4_ * auVar168._8_4_;
            auVar163._12_4_ = auVar162._12_4_ * auVar168._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_288._0_8_ * 4) = auVar163;
        lVar145 = local_158._0_8_ + 4;
        local_258 = local_258 + 4;
        local_268._0_8_ = local_268._0_8_ + 4;
        local_138._0_8_ = local_138._0_8_ + 4;
        uVar148 = local_178._0_8_ + 1;
      }
      for (lVar145 = (long)(int)(local_198._0_4_ + uVar141 * 4); pauVar146 = local_378,
          lVar145 < (long)local_2d0; lVar145 = lVar145 + 1) {
        if (lVar8 == 0) {
          auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar301 = ZEXT464(*(uint *)(lVar8 + lVar145 * 4));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar150 = (long)(this->weight_data_tm).w;
        pauVar152 = (undefined1 (*) [16])(lVar145 * lVar150 * sVar10 + (long)pvVar9);
        auVar163 = ZEXT816(0) << 0x40;
        lVar151 = 0;
        iVar161 = 0;
        pauVar159 = local_378;
        while( true ) {
          auVar326 = ZEXT1664(auVar163);
          local_1c8 = ZEXT1632(auVar163);
          if (iVar143 <= iVar161 + 7) break;
          auVar163 = vlddqu_avx(*pauVar152);
          auVar186 = vcvtph2ps_f16c(auVar163);
          auVar163 = vfmadd231ps_fma(local_1c8,auVar186,*pauVar159);
          pauVar159 = pauVar159 + 1;
          pauVar152 = pauVar152 + 1;
          iVar161 = iVar161 + 8;
          lVar151 = lVar151 + 8;
        }
        local_2e8 = ZEXT816(0) << 0x40;
        for (; iVar161 + 3 < iVar143; iVar161 = iVar161 + 4) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)*pauVar152;
          auVar163 = vcvtph2ps_f16c(auVar5);
          local_2e8 = vfmadd231ps_fma(local_2e8,auVar163,*(undefined1 (*) [16])*pauVar159);
          pauVar159 = (undefined1 (*) [32])(*pauVar159 + 0x10);
          pauVar152 = (undefined1 (*) [16])(*pauVar152 + 8);
          lVar151 = lVar151 + 4;
        }
        while( true ) {
          if (iVar143 <= (int)lVar151) break;
          local_328._0_4_ = auVar301._0_4_;
          local_308._0_4_ = *(undefined4 *)(*pauVar146 + lVar151 * 4);
          auVar306._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar9 + lVar151 * 2 + sVar10 * lVar145 * lVar150));
          auVar306._4_60_ = extraout_var_01;
          auVar163 = vfmadd231ss_fma(ZEXT416((uint)local_328._0_4_),auVar306._0_16_,
                                     ZEXT416((uint)local_308._0_4_));
          auVar301 = ZEXT1664(auVar163);
          lVar151 = lVar151 + 1;
          auVar326 = ZEXT3264(local_1c8);
        }
        auVar221._0_4_ = auVar326._16_4_ + auVar326._0_4_;
        auVar221._4_4_ = auVar326._20_4_ + auVar326._4_4_;
        auVar221._8_4_ = auVar326._24_4_ + auVar326._8_4_;
        auVar221._12_4_ = auVar326._28_4_ + auVar326._12_4_;
        auVar163 = vshufps_avx(local_2e8,auVar221,0x41);
        auVar162 = vshufps_avx(local_2e8,auVar221,0xeb);
        auVar222._0_4_ = auVar162._0_4_ + auVar163._0_4_;
        auVar222._4_4_ = auVar162._4_4_ + auVar163._4_4_;
        auVar222._8_4_ = auVar162._8_4_ + auVar163._8_4_;
        auVar222._12_4_ = auVar162._12_4_ + auVar163._12_4_;
        auVar163 = vshufpd_avx(auVar222,auVar222,1);
        auVar223._0_4_ = auVar222._0_4_ + auVar163._0_4_;
        auVar223._4_4_ = auVar222._4_4_ + auVar163._4_4_;
        auVar223._8_4_ = auVar222._8_4_ + auVar163._8_4_;
        auVar223._12_4_ = auVar222._12_4_ + auVar163._12_4_;
        auVar163 = vhaddps_avx(auVar223,auVar223);
        fVar217 = auVar301._0_4_ + auVar163._0_4_;
        auVar163 = ZEXT416((uint)fVar217);
        fVar218 = fVar217;
        switch(iVar140) {
        case 1:
          auVar163 = vmaxss_avx(auVar163,ZEXT416(0));
          fVar218 = auVar163._0_4_;
          break;
        case 2:
          uVar15 = vcmpss_avx512f(auVar163,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar218 = (float)((uint)bVar11 * 0x3f800000 +
                           (uint)!bVar11 * **(int **)(&this->field_0xe8 + (long)p_Var6)) * fVar217;
          break;
        case 3:
          fVar217 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar163 = vmaxss_avx(auVar163,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          fVar218 = auVar163._0_4_;
          if (fVar217 < auVar163._0_4_) {
            fVar218 = fVar217;
          }
          break;
        case 4:
          auVar163 = vminss_avx(auVar163,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar46._8_4_ = 0x80000000;
          auVar46._0_8_ = 0x8000000080000000;
          auVar46._12_4_ = 0x80000000;
          auVar162 = vxorps_avx512vl(auVar163,auVar46);
          uVar15 = vcmpss_avx512f(auVar163,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar217 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar162._0_4_));
          fVar218 = 1.0 / (fVar217 + 1.0);
          break;
        case 5:
          local_328._0_4_ = fVar217;
          fVar217 = expf(fVar217);
          fVar217 = logf(fVar217 + 1.0);
          fVar217 = tanhf(fVar217);
          fVar218 = fVar217 * (float)local_328._0_4_;
          break;
        case 6:
          fVar4 = **(float **)(&this->field_0xe8 + (long)p_Var6);
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar164 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var6))[1]);
          auVar162 = vxorps_avx512vl(auVar164,auVar45);
          fVar254 = auVar162._0_4_ / fVar4;
          fVar218 = 0.0;
          if ((fVar254 <= fVar217) && (fVar218 = fVar217, fVar217 <= fVar254 + 1.0 / fVar4)) {
            auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar163,auVar164);
            fVar218 = auVar163._0_4_ * fVar217;
          }
        }
        *(float *)((long)top_blob->data + lVar145 * 4) = fVar218;
      }
    }
    iVar140 = 0;
  }
  if (piStack_370 != (int *)0x0) {
    LOCK();
    *piStack_370 = *piStack_370 + -1;
    UNLOCK();
    if (*piStack_370 == 0) {
      if (local_358 == (Allocator *)0x0) {
        free(local_378);
      }
      else {
        (*local_358->_vptr_Allocator[3])();
      }
    }
  }
  return iVar140;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}